

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O1

bool embree::avx2::CurveNiIntersectorK<8,8>::
     occluded_t<embree::avx2::RibbonCurve1IntersectorK<embree::BSplineCurveT,8,8>,embree::avx2::Occluded1KEpilogMU<8,8,true>>
               (Precalculations *pre,RayK<8> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  undefined1 (*pauVar1) [16];
  undefined1 (*pauVar2) [16];
  undefined1 (*pauVar3) [16];
  undefined1 (*pauVar4) [16];
  undefined1 (*pauVar5) [28];
  undefined1 (*pauVar6) [32];
  float *pfVar7;
  undefined4 uVar8;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar9;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  Primitive PVar17;
  Geometry *pGVar18;
  RTCFilterFunctionN p_Var19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  long lVar24;
  long lVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  float fVar82;
  float fVar83;
  float fVar84;
  float fVar85;
  undefined8 uVar86;
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [28];
  undefined1 auVar94 [28];
  uint uVar95;
  int iVar96;
  uint uVar97;
  ulong uVar98;
  ulong uVar99;
  ulong uVar100;
  Geometry *geometry;
  long lVar101;
  ulong uVar102;
  bool bVar103;
  bool bVar104;
  undefined4 uVar105;
  undefined8 uVar106;
  undefined1 auVar107 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar108 [16];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined8 uVar122;
  undefined8 extraout_XMM1_Qa;
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [64];
  undefined1 extraout_var [56];
  float fVar132;
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  float fVar133;
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar148 [64];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  float fVar166;
  float fVar167;
  float fVar168;
  float fVar169;
  float fVar170;
  float fVar171;
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined8 uVar172;
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  undefined1 auVar184 [64];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [32];
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  undefined1 auVar190 [32];
  float fVar191;
  float fVar197;
  float fVar198;
  float fVar199;
  float fVar200;
  float fVar201;
  float fVar202;
  undefined1 auVar192 [32];
  undefined1 auVar193 [32];
  undefined1 auVar194 [32];
  undefined1 auVar195 [64];
  undefined1 auVar196 [64];
  undefined1 auVar203 [16];
  undefined1 auVar204 [32];
  undefined1 auVar205 [32];
  undefined1 in_ZMM10 [64];
  undefined4 uVar206;
  undefined1 auVar207 [16];
  undefined1 auVar208 [32];
  float fVar209;
  undefined1 auVar210 [16];
  undefined1 auVar211 [32];
  undefined1 auVar212 [32];
  float fVar215;
  undefined1 in_ZMM12 [64];
  undefined1 auVar213 [64];
  undefined1 auVar214 [64];
  undefined1 auVar216 [32];
  undefined1 auVar217 [32];
  undefined1 auVar218 [64];
  float fVar221;
  undefined1 auVar219 [32];
  undefined1 auVar220 [32];
  float fVar222;
  float fVar225;
  undefined1 auVar223 [32];
  undefined1 auVar224 [32];
  RTCFilterFunctionNArguments args;
  RibbonHit<embree::BSplineCurveT<embree::Vec3fx>,_8> bhit;
  bool local_96d;
  undefined1 local_960 [32];
  undefined1 local_940 [32];
  float local_8e0;
  float fStack_8dc;
  float fStack_8d8;
  float fStack_8d4;
  float fStack_8d0;
  float fStack_8cc;
  float fStack_8c8;
  RTCFilterFunctionNArguments local_7b0;
  undefined1 local_780 [32];
  float local_760;
  float fStack_75c;
  float fStack_758;
  float fStack_754;
  float fStack_750;
  float fStack_74c;
  float fStack_748;
  float fStack_744;
  undefined1 local_740 [32];
  undefined8 local_710;
  undefined8 uStack_708;
  undefined8 local_700;
  undefined8 uStack_6f8;
  undefined8 local_6f0;
  undefined8 uStack_6e8;
  undefined1 local_6e0 [8];
  float fStack_6d8;
  float fStack_6d4;
  float fStack_6d0;
  float fStack_6cc;
  float fStack_6c8;
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [8];
  float fStack_698;
  float fStack_694;
  float fStack_690;
  float fStack_68c;
  float fStack_688;
  int iStack_684;
  undefined1 local_680 [8];
  float fStack_678;
  float fStack_674;
  undefined1 auStack_670 [8];
  float fStack_668;
  undefined1 local_660 [8];
  undefined8 uStack_658;
  undefined1 local_640 [32];
  undefined1 local_620 [32];
  undefined1 local_600 [32];
  undefined8 local_5e0;
  undefined8 uStack_5d8;
  undefined8 uStack_5d0;
  undefined8 uStack_5c8;
  LinearSpace3fa *local_5a8;
  undefined8 local_5a0;
  undefined8 uStack_598;
  undefined8 uStack_590;
  undefined8 uStack_588;
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  ulong local_540;
  uint uStack_538;
  uint uStack_534;
  uint uStack_530;
  uint uStack_52c;
  uint uStack_528;
  uint uStack_524;
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [8];
  float fStack_4b8;
  float fStack_4b4;
  float fStack_4b0;
  float fStack_4ac;
  float fStack_4a8;
  float fStack_4a4;
  undefined4 local_490;
  undefined4 uStack_48c;
  undefined4 uStack_488;
  undefined4 uStack_484;
  undefined1 local_480 [32];
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  int local_420;
  int local_41c;
  undefined8 local_410;
  undefined8 uStack_408;
  undefined8 local_400;
  undefined8 uStack_3f8;
  undefined8 local_3f0;
  undefined8 uStack_3e8;
  undefined8 local_3e0;
  undefined8 uStack_3d8;
  undefined1 local_3c0 [32];
  float local_3a0 [4];
  float fStack_390;
  float fStack_38c;
  float fStack_388;
  float fStack_384;
  undefined8 local_380;
  undefined8 uStack_378;
  undefined8 uStack_370;
  undefined8 uStack_368;
  undefined8 local_360;
  undefined8 uStack_358;
  undefined8 uStack_350;
  undefined8 uStack_348;
  undefined1 local_340 [32];
  undefined1 local_320 [8];
  float fStack_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  float fStack_308;
  float fStack_304;
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined4 local_2a0;
  undefined4 uStack_29c;
  undefined4 uStack_298;
  undefined4 uStack_294;
  undefined4 uStack_290;
  undefined4 uStack_28c;
  undefined4 uStack_288;
  undefined4 uStack_284;
  undefined8 local_280;
  undefined8 uStack_278;
  undefined8 uStack_270;
  undefined8 uStack_268;
  undefined8 local_260;
  undefined8 uStack_258;
  undefined8 uStack_250;
  undefined8 uStack_248;
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  undefined1 local_1e0 [32];
  uint local_1c0;
  uint uStack_1bc;
  uint uStack_1b8;
  uint uStack_1b4;
  uint uStack_1b0;
  uint uStack_1ac;
  uint uStack_1a8;
  uint uStack_1a4;
  uint local_1a0;
  uint uStack_19c;
  uint uStack_198;
  uint uStack_194;
  uint uStack_190;
  uint uStack_18c;
  uint uStack_188;
  uint uStack_184;
  float local_180;
  float fStack_17c;
  float fStack_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  float fStack_168;
  float fStack_164;
  uint local_160;
  uint uStack_15c;
  uint uStack_158;
  uint uStack_154;
  uint uStack_150;
  uint uStack_14c;
  uint uStack_148;
  uint uStack_144;
  undefined4 local_140;
  undefined4 uStack_13c;
  undefined4 uStack_138;
  undefined4 uStack_134;
  undefined4 uStack_130;
  undefined4 uStack_12c;
  undefined4 uStack_128;
  undefined4 uStack_124;
  undefined1 local_120 [32];
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  
  PVar17 = prim[1];
  uVar102 = (ulong)(byte)PVar17;
  auVar153 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                           0x10);
  auVar153 = vinsertps_avx(auVar153,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar20 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar20 = vinsertps_avx(auVar20,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  fVar133 = *(float *)(prim + uVar102 * 0x19 + 0x12);
  auVar153 = vsubps_avx(auVar153,*(undefined1 (*) [16])(prim + uVar102 * 0x19 + 6));
  auVar107._0_4_ = fVar133 * auVar153._0_4_;
  auVar107._4_4_ = fVar133 * auVar153._4_4_;
  auVar107._8_4_ = fVar133 * auVar153._8_4_;
  auVar107._12_4_ = fVar133 * auVar153._12_4_;
  auVar173._0_4_ = fVar133 * auVar20._0_4_;
  auVar173._4_4_ = fVar133 * auVar20._4_4_;
  auVar173._8_4_ = fVar133 * auVar20._8_4_;
  auVar173._12_4_ = fVar133 * auVar20._12_4_;
  auVar153._8_8_ = 0;
  auVar153._0_8_ = *(ulong *)(prim + uVar102 * 4 + 6);
  auVar110 = vpmovsxbd_avx2(auVar153);
  auVar110 = vcvtdq2ps_avx(auVar110);
  auVar20._8_8_ = 0;
  auVar20._0_8_ = *(ulong *)(prim + uVar102 * 5 + 6);
  auVar120 = vpmovsxbd_avx2(auVar20);
  auVar120 = vcvtdq2ps_avx(auVar120);
  auVar150._8_8_ = 0;
  auVar150._0_8_ = *(ulong *)(prim + uVar102 * 6 + 6);
  auVar165 = vpmovsxbd_avx2(auVar150);
  auVar165 = vcvtdq2ps_avx(auVar165);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + uVar102 * 0xb + 6);
  auVar118 = vpmovsxbd_avx2(auVar11);
  auVar118 = vcvtdq2ps_avx(auVar118);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(prim + (ulong)((uint)(byte)PVar17 * 0xc) + 6);
  auVar128 = vpmovsxbd_avx2(auVar12);
  auVar128 = vcvtdq2ps_avx(auVar128);
  auVar13._8_8_ = 0;
  auVar13._0_8_ = *(ulong *)(prim + (uint)(byte)PVar17 * 0xc + uVar102 + 6);
  auVar22 = vpmovsxbd_avx2(auVar13);
  auVar22 = vcvtdq2ps_avx(auVar22);
  uVar98 = (ulong)(uint)((int)(uVar102 * 9) * 2);
  auVar14._8_8_ = 0;
  auVar14._0_8_ = *(ulong *)(prim + uVar98 + 6);
  auVar161 = vpmovsxbd_avx2(auVar14);
  auVar161 = vcvtdq2ps_avx(auVar161);
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *(ulong *)(prim + uVar98 + uVar102 + 6);
  auVar23 = vpmovsxbd_avx2(auVar15);
  auVar23 = vcvtdq2ps_avx(auVar23);
  uVar98 = (ulong)(uint)((int)(uVar102 * 5) << 2);
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *(ulong *)(prim + uVar98 + 6);
  auVar121 = vpmovsxbd_avx2(auVar16);
  auVar121 = vcvtdq2ps_avx(auVar121);
  auVar179._4_4_ = auVar173._0_4_;
  auVar179._0_4_ = auVar173._0_4_;
  auVar179._8_4_ = auVar173._0_4_;
  auVar179._12_4_ = auVar173._0_4_;
  auVar179._16_4_ = auVar173._0_4_;
  auVar179._20_4_ = auVar173._0_4_;
  auVar179._24_4_ = auVar173._0_4_;
  auVar179._28_4_ = auVar173._0_4_;
  auVar153 = vmovshdup_avx(auVar173);
  uVar172 = auVar153._0_8_;
  auVar223._8_8_ = uVar172;
  auVar223._0_8_ = uVar172;
  auVar223._16_8_ = uVar172;
  auVar223._24_8_ = uVar172;
  auVar153 = vshufps_avx(auVar173,auVar173,0xaa);
  fVar133 = auVar153._0_4_;
  auVar213._0_4_ = fVar133 * auVar165._0_4_;
  fVar132 = auVar153._4_4_;
  auVar213._4_4_ = fVar132 * auVar165._4_4_;
  auVar213._8_4_ = fVar133 * auVar165._8_4_;
  auVar213._12_4_ = fVar132 * auVar165._12_4_;
  auVar213._16_4_ = fVar133 * auVar165._16_4_;
  auVar213._20_4_ = fVar132 * auVar165._20_4_;
  auVar213._28_36_ = in_ZMM12._28_36_;
  auVar213._24_4_ = fVar133 * auVar165._24_4_;
  auVar184._0_4_ = auVar22._0_4_ * fVar133;
  auVar184._4_4_ = auVar22._4_4_ * fVar132;
  auVar184._8_4_ = auVar22._8_4_ * fVar133;
  auVar184._12_4_ = auVar22._12_4_ * fVar132;
  auVar184._16_4_ = auVar22._16_4_ * fVar133;
  auVar184._20_4_ = auVar22._20_4_ * fVar132;
  auVar184._28_36_ = in_ZMM10._28_36_;
  auVar184._24_4_ = auVar22._24_4_ * fVar133;
  auVar187._0_4_ = auVar121._0_4_ * fVar133;
  auVar187._4_4_ = auVar121._4_4_ * fVar132;
  auVar187._8_4_ = auVar121._8_4_ * fVar133;
  auVar187._12_4_ = auVar121._12_4_ * fVar132;
  auVar187._16_4_ = auVar121._16_4_ * fVar133;
  auVar187._20_4_ = auVar121._20_4_ * fVar132;
  auVar187._24_4_ = auVar121._24_4_ * fVar133;
  auVar187._28_4_ = 0;
  auVar153 = vfmadd231ps_fma(auVar213._0_32_,auVar223,auVar120);
  auVar20 = vfmadd231ps_fma(auVar184._0_32_,auVar223,auVar128);
  auVar150 = vfmadd231ps_fma(auVar187,auVar23,auVar223);
  auVar11 = vfmadd231ps_fma(ZEXT1632(auVar153),auVar179,auVar110);
  auVar20 = vfmadd231ps_fma(ZEXT1632(auVar20),auVar179,auVar118);
  auVar150 = vfmadd231ps_fma(ZEXT1632(auVar150),auVar161,auVar179);
  auVar216._4_4_ = auVar107._0_4_;
  auVar216._0_4_ = auVar107._0_4_;
  auVar216._8_4_ = auVar107._0_4_;
  auVar216._12_4_ = auVar107._0_4_;
  auVar216._16_4_ = auVar107._0_4_;
  auVar216._20_4_ = auVar107._0_4_;
  auVar216._24_4_ = auVar107._0_4_;
  auVar216._28_4_ = auVar107._0_4_;
  auVar153 = vmovshdup_avx(auVar107);
  uVar172 = auVar153._0_8_;
  auVar224._8_8_ = uVar172;
  auVar224._0_8_ = uVar172;
  auVar224._16_8_ = uVar172;
  auVar224._24_8_ = uVar172;
  auVar153 = vshufps_avx(auVar107,auVar107,0xaa);
  fVar133 = auVar153._0_4_;
  auVar123._0_4_ = fVar133 * auVar165._0_4_;
  fVar132 = auVar153._4_4_;
  auVar123._4_4_ = fVar132 * auVar165._4_4_;
  auVar123._8_4_ = fVar133 * auVar165._8_4_;
  auVar123._12_4_ = fVar132 * auVar165._12_4_;
  auVar123._16_4_ = fVar133 * auVar165._16_4_;
  auVar123._20_4_ = fVar132 * auVar165._20_4_;
  auVar123._24_4_ = fVar133 * auVar165._24_4_;
  auVar123._28_4_ = 0;
  auVar21._4_4_ = auVar22._4_4_ * fVar132;
  auVar21._0_4_ = auVar22._0_4_ * fVar133;
  auVar21._8_4_ = auVar22._8_4_ * fVar133;
  auVar21._12_4_ = auVar22._12_4_ * fVar132;
  auVar21._16_4_ = auVar22._16_4_ * fVar133;
  auVar21._20_4_ = auVar22._20_4_ * fVar132;
  auVar21._24_4_ = auVar22._24_4_ * fVar133;
  auVar21._28_4_ = auVar165._28_4_;
  auVar165._4_4_ = auVar121._4_4_ * fVar132;
  auVar165._0_4_ = auVar121._0_4_ * fVar133;
  auVar165._8_4_ = auVar121._8_4_ * fVar133;
  auVar165._12_4_ = auVar121._12_4_ * fVar132;
  auVar165._16_4_ = auVar121._16_4_ * fVar133;
  auVar165._20_4_ = auVar121._20_4_ * fVar132;
  auVar165._24_4_ = auVar121._24_4_ * fVar133;
  auVar165._28_4_ = fVar132;
  auVar153 = vfmadd231ps_fma(auVar123,auVar224,auVar120);
  auVar12 = vfmadd231ps_fma(auVar21,auVar224,auVar128);
  auVar13 = vfmadd231ps_fma(auVar165,auVar224,auVar23);
  auVar14 = vfmadd231ps_fma(ZEXT1632(auVar153),auVar216,auVar110);
  local_2e0._8_4_ = 0x7fffffff;
  local_2e0._0_8_ = 0x7fffffff7fffffff;
  local_2e0._12_4_ = 0x7fffffff;
  local_2e0._16_4_ = 0x7fffffff;
  local_2e0._20_4_ = 0x7fffffff;
  local_2e0._24_4_ = 0x7fffffff;
  local_2e0._28_4_ = 0x7fffffff;
  auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),auVar216,auVar118);
  auVar110 = vandps_avx(ZEXT1632(auVar11),local_2e0);
  auVar139._8_4_ = 0x219392ef;
  auVar139._0_8_ = 0x219392ef219392ef;
  auVar139._12_4_ = 0x219392ef;
  auVar139._16_4_ = 0x219392ef;
  auVar139._20_4_ = 0x219392ef;
  auVar139._24_4_ = 0x219392ef;
  auVar139._28_4_ = 0x219392ef;
  auVar110 = vcmpps_avx(auVar110,auVar139,1);
  auVar120 = vblendvps_avx(ZEXT1632(auVar11),auVar139,auVar110);
  auVar110 = vandps_avx(ZEXT1632(auVar20),local_2e0);
  auVar110 = vcmpps_avx(auVar110,auVar139,1);
  auVar165 = vblendvps_avx(ZEXT1632(auVar20),auVar139,auVar110);
  auVar110 = vandps_avx(ZEXT1632(auVar150),local_2e0);
  auVar110 = vcmpps_avx(auVar110,auVar139,1);
  auVar118 = vrcpps_avx(auVar120);
  auVar110 = vblendvps_avx(ZEXT1632(auVar150),auVar139,auVar110);
  auVar177._8_4_ = 0x3f800000;
  auVar177._0_8_ = &DAT_3f8000003f800000;
  auVar177._12_4_ = 0x3f800000;
  auVar177._16_4_ = 0x3f800000;
  auVar177._20_4_ = 0x3f800000;
  auVar177._24_4_ = 0x3f800000;
  auVar177._28_4_ = 0x3f800000;
  auVar11 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar216,auVar161);
  auVar128 = vrcpps_avx(auVar165);
  auVar153 = vfnmadd213ps_fma(auVar120,auVar118,auVar177);
  auVar153 = vfmadd132ps_fma(ZEXT1632(auVar153),auVar118,auVar118);
  auVar20 = vfnmadd213ps_fma(auVar165,auVar128,auVar177);
  auVar20 = vfmadd132ps_fma(ZEXT1632(auVar20),auVar128,auVar128);
  auVar120 = vrcpps_avx(auVar110);
  auVar150 = vfnmadd213ps_fma(auVar110,auVar120,auVar177);
  auVar110 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar102 * 7 + 6));
  auVar150 = vfmadd132ps_fma(ZEXT1632(auVar150),auVar120,auVar120);
  auVar110 = vcvtdq2ps_avx(auVar110);
  auVar110 = vsubps_avx(auVar110,ZEXT1632(auVar14));
  auVar118._4_4_ = auVar153._4_4_ * auVar110._4_4_;
  auVar118._0_4_ = auVar153._0_4_ * auVar110._0_4_;
  auVar118._8_4_ = auVar153._8_4_ * auVar110._8_4_;
  auVar118._12_4_ = auVar153._12_4_ * auVar110._12_4_;
  auVar118._16_4_ = auVar110._16_4_ * 0.0;
  auVar118._20_4_ = auVar110._20_4_ * 0.0;
  auVar118._24_4_ = auVar110._24_4_ * 0.0;
  auVar118._28_4_ = auVar110._28_4_;
  auVar110 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar102 * 9 + 6));
  auVar110 = vcvtdq2ps_avx(auVar110);
  auVar110 = vsubps_avx(auVar110,ZEXT1632(auVar14));
  auVar112._0_4_ = auVar153._0_4_ * auVar110._0_4_;
  auVar112._4_4_ = auVar153._4_4_ * auVar110._4_4_;
  auVar112._8_4_ = auVar153._8_4_ * auVar110._8_4_;
  auVar112._12_4_ = auVar153._12_4_ * auVar110._12_4_;
  auVar112._16_4_ = auVar110._16_4_ * 0.0;
  auVar112._20_4_ = auVar110._20_4_ * 0.0;
  auVar112._24_4_ = auVar110._24_4_ * 0.0;
  auVar112._28_4_ = 0;
  auVar121._1_3_ = 0;
  auVar121[0] = PVar17;
  auVar120 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)PVar17 * 0x10 + 6));
  auVar110 = vpmovsxwd_avx2(*(undefined1 (*) [16])
                             (prim + (ulong)(byte)PVar17 * 0x10 + uVar102 * -2 + 6));
  auVar110 = vcvtdq2ps_avx(auVar110);
  auVar110 = vsubps_avx(auVar110,ZEXT1632(auVar12));
  auVar128._4_4_ = auVar110._4_4_ * auVar20._4_4_;
  auVar128._0_4_ = auVar110._0_4_ * auVar20._0_4_;
  auVar128._8_4_ = auVar110._8_4_ * auVar20._8_4_;
  auVar128._12_4_ = auVar110._12_4_ * auVar20._12_4_;
  auVar128._16_4_ = auVar110._16_4_ * 0.0;
  auVar128._20_4_ = auVar110._20_4_ * 0.0;
  auVar128._24_4_ = auVar110._24_4_ * 0.0;
  auVar128._28_4_ = auVar110._28_4_;
  auVar110 = vcvtdq2ps_avx(auVar120);
  auVar110 = vsubps_avx(auVar110,ZEXT1632(auVar12));
  auVar22._4_4_ = auVar20._4_4_ * auVar110._4_4_;
  auVar22._0_4_ = auVar20._0_4_ * auVar110._0_4_;
  auVar22._8_4_ = auVar20._8_4_ * auVar110._8_4_;
  auVar22._12_4_ = auVar20._12_4_ * auVar110._12_4_;
  auVar22._16_4_ = auVar110._16_4_ * 0.0;
  auVar22._20_4_ = auVar110._20_4_ * 0.0;
  auVar22._24_4_ = auVar110._24_4_ * 0.0;
  auVar22._28_4_ = auVar110._28_4_;
  auVar110 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar98 + uVar102 + 6));
  auVar110 = vcvtdq2ps_avx(auVar110);
  auVar110 = vsubps_avx(auVar110,ZEXT1632(auVar11));
  auVar161._4_4_ = auVar110._4_4_ * auVar150._4_4_;
  auVar161._0_4_ = auVar110._0_4_ * auVar150._0_4_;
  auVar161._8_4_ = auVar110._8_4_ * auVar150._8_4_;
  auVar161._12_4_ = auVar110._12_4_ * auVar150._12_4_;
  auVar161._16_4_ = auVar110._16_4_ * 0.0;
  auVar161._20_4_ = auVar110._20_4_ * 0.0;
  auVar161._24_4_ = auVar110._24_4_ * 0.0;
  auVar161._28_4_ = auVar110._28_4_;
  auVar110 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar102 * 0x17 + 6));
  auVar110 = vcvtdq2ps_avx(auVar110);
  auVar110 = vsubps_avx(auVar110,ZEXT1632(auVar11));
  auVar23._4_4_ = auVar150._4_4_ * auVar110._4_4_;
  auVar23._0_4_ = auVar150._0_4_ * auVar110._0_4_;
  auVar23._8_4_ = auVar150._8_4_ * auVar110._8_4_;
  auVar23._12_4_ = auVar150._12_4_ * auVar110._12_4_;
  auVar23._16_4_ = auVar110._16_4_ * 0.0;
  auVar23._20_4_ = auVar110._20_4_ * 0.0;
  auVar23._24_4_ = auVar110._24_4_ * 0.0;
  auVar23._28_4_ = auVar110._28_4_;
  auVar110 = vpminsd_avx2(auVar118,auVar112);
  auVar120 = vpminsd_avx2(auVar128,auVar22);
  auVar110 = vmaxps_avx(auVar110,auVar120);
  auVar120 = vpminsd_avx2(auVar161,auVar23);
  uVar105 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar192._4_4_ = uVar105;
  auVar192._0_4_ = uVar105;
  auVar192._8_4_ = uVar105;
  auVar192._12_4_ = uVar105;
  auVar192._16_4_ = uVar105;
  auVar192._20_4_ = uVar105;
  auVar192._24_4_ = uVar105;
  auVar192._28_4_ = uVar105;
  auVar120 = vmaxps_avx(auVar120,auVar192);
  auVar110 = vmaxps_avx(auVar110,auVar120);
  local_80._4_4_ = auVar110._4_4_ * 0.99999964;
  local_80._0_4_ = auVar110._0_4_ * 0.99999964;
  local_80._8_4_ = auVar110._8_4_ * 0.99999964;
  local_80._12_4_ = auVar110._12_4_ * 0.99999964;
  local_80._16_4_ = auVar110._16_4_ * 0.99999964;
  local_80._20_4_ = auVar110._20_4_ * 0.99999964;
  local_80._24_4_ = auVar110._24_4_ * 0.99999964;
  local_80._28_4_ = 0x3f7ffffa;
  auVar110 = vpmaxsd_avx2(auVar118,auVar112);
  auVar120 = vpmaxsd_avx2(auVar128,auVar22);
  auVar110 = vminps_avx(auVar110,auVar120);
  auVar120 = vpmaxsd_avx2(auVar161,auVar23);
  uVar105 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar138._4_4_ = uVar105;
  auVar138._0_4_ = uVar105;
  auVar138._8_4_ = uVar105;
  auVar138._12_4_ = uVar105;
  auVar138._16_4_ = uVar105;
  auVar138._20_4_ = uVar105;
  auVar138._24_4_ = uVar105;
  auVar138._28_4_ = uVar105;
  auVar120 = vminps_avx(auVar120,auVar138);
  auVar110 = vminps_avx(auVar110,auVar120);
  auVar120._4_4_ = auVar110._4_4_ * 1.0000004;
  auVar120._0_4_ = auVar110._0_4_ * 1.0000004;
  auVar120._8_4_ = auVar110._8_4_ * 1.0000004;
  auVar120._12_4_ = auVar110._12_4_ * 1.0000004;
  auVar120._16_4_ = auVar110._16_4_ * 1.0000004;
  auVar120._20_4_ = auVar110._20_4_ * 1.0000004;
  auVar120._24_4_ = auVar110._24_4_ * 1.0000004;
  auVar120._28_4_ = auVar110._28_4_;
  auVar121[4] = PVar17;
  auVar121._5_3_ = 0;
  auVar121[8] = PVar17;
  auVar121._9_3_ = 0;
  auVar121[0xc] = PVar17;
  auVar121._13_3_ = 0;
  auVar121[0x10] = PVar17;
  auVar121._17_3_ = 0;
  auVar121[0x14] = PVar17;
  auVar121._21_3_ = 0;
  auVar121[0x18] = PVar17;
  auVar121._25_3_ = 0;
  auVar121[0x1c] = PVar17;
  auVar121._29_3_ = 0;
  auVar110 = vcmpps_avx(local_80,auVar120,2);
  auVar120 = vpcmpgtd_avx2(auVar121,_DAT_0205a920);
  auVar110 = vandps_avx(auVar110,auVar120);
  uVar95 = vmovmskps_avx(auVar110);
  local_96d = uVar95 != 0;
  if (local_96d) {
    uVar95 = uVar95 & 0xff;
    local_5a8 = pre->ray_space + k;
    local_5a0 = mm_lookupmask_ps._16_8_;
    uStack_598 = mm_lookupmask_ps._24_8_;
    uStack_590 = mm_lookupmask_ps._16_8_;
    uStack_588 = mm_lookupmask_ps._24_8_;
    iVar96 = 1 << ((uint)k & 0x1f);
    auVar110._4_4_ = iVar96;
    auVar110._0_4_ = iVar96;
    auVar110._8_4_ = iVar96;
    auVar110._12_4_ = iVar96;
    auVar110._16_4_ = iVar96;
    auVar110._20_4_ = iVar96;
    auVar110._24_4_ = iVar96;
    auVar110._28_4_ = iVar96;
    auVar120 = vpmovzxbd_avx2(ZEXT816(0x8040201008040201));
    auVar110 = vpand_avx2(auVar110,auVar120);
    local_300 = vpcmpeqd_avx2(auVar110,auVar120);
    local_490 = 0x7fffffff;
    uStack_48c = 0x7fffffff;
    uStack_488 = 0x7fffffff;
    uStack_484 = 0x7fffffff;
    do {
      auVar110 = local_520;
      lVar24 = 0;
      uVar102 = (ulong)uVar95;
      for (uVar98 = uVar102; (uVar98 & 1) == 0; uVar98 = uVar98 >> 1 | 0x8000000000000000) {
        lVar24 = lVar24 + 1;
      }
      uVar95 = *(uint *)(prim + 2);
      local_640._4_4_ = *(undefined4 *)(prim + lVar24 * 4 + 6);
      local_540 = (ulong)(uint)local_640._4_4_;
      pGVar18 = (context->scene->geometries).items[uVar95].ptr;
      uVar98 = (ulong)*(uint *)(*(long *)&pGVar18->field_0x58 +
                               pGVar18[1].super_RefCount.refCounter.
                               super___atomic_base<unsigned_long>._M_i * local_540);
      p_Var19 = pGVar18[1].intersectionFilterN;
      lVar24 = *(long *)&pGVar18[1].time_range.upper;
      pauVar1 = (undefined1 (*) [16])(lVar24 + (long)p_Var19 * uVar98);
      uVar172 = *(undefined8 *)*pauVar1;
      uVar86 = *(undefined8 *)(*pauVar1 + 8);
      auVar20 = *pauVar1;
      auVar153 = *pauVar1;
      pauVar2 = (undefined1 (*) [16])(lVar24 + (uVar98 + 1) * (long)p_Var19);
      local_6f0 = *(undefined8 *)*pauVar2;
      uStack_6e8 = *(undefined8 *)(*pauVar2 + 8);
      pauVar3 = (undefined1 (*) [16])(lVar24 + (uVar98 + 2) * (long)p_Var19);
      local_700 = *(undefined8 *)*pauVar3;
      uStack_6f8 = *(undefined8 *)(*pauVar3 + 8);
      uVar102 = uVar102 - 1 & uVar102;
      pauVar4 = (undefined1 (*) [16])(lVar24 + (uVar98 + 3) * (long)p_Var19);
      local_710 = *(undefined8 *)*pauVar4;
      uStack_708 = *(undefined8 *)(*pauVar4 + 8);
      if (uVar102 != 0) {
        uVar100 = uVar102 - 1 & uVar102;
        for (uVar98 = uVar102; (uVar98 & 1) == 0; uVar98 = uVar98 >> 1 | 0x8000000000000000) {
        }
        if (uVar100 != 0) {
          for (; (uVar100 & 1) == 0; uVar100 = uVar100 >> 1 | 0x8000000000000000) {
          }
        }
      }
      iVar96 = (int)pGVar18[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      auVar150 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),
                               ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x1c);
      auVar13 = vinsertps_avx(auVar150,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
      auVar11 = vsubps_avx(*pauVar1,auVar13);
      uVar105 = auVar11._0_4_;
      auVar149._4_4_ = uVar105;
      auVar149._0_4_ = uVar105;
      auVar149._8_4_ = uVar105;
      auVar149._12_4_ = uVar105;
      auVar150 = vshufps_avx(auVar11,auVar11,0x55);
      auVar11 = vshufps_avx(auVar11,auVar11,0xaa);
      aVar9 = (local_5a8->vx).field_0;
      aVar10 = (local_5a8->vy).field_0;
      fVar133 = (local_5a8->vz).field_0.m128[0];
      fVar132 = *(float *)((long)&(local_5a8->vz).field_0 + 4);
      fVar166 = *(float *)((long)&(local_5a8->vz).field_0 + 8);
      fVar167 = *(float *)((long)&(local_5a8->vz).field_0 + 0xc);
      auVar174._0_4_ = fVar133 * auVar11._0_4_;
      auVar174._4_4_ = fVar132 * auVar11._4_4_;
      auVar174._8_4_ = fVar166 * auVar11._8_4_;
      auVar174._12_4_ = fVar167 * auVar11._12_4_;
      auVar150 = vfmadd231ps_fma(auVar174,(undefined1  [16])aVar10,auVar150);
      auVar15 = vfmadd231ps_fma(auVar150,(undefined1  [16])aVar9,auVar149);
      auVar150 = vblendps_avx(auVar15,*pauVar1,8);
      auVar12 = vsubps_avx(*pauVar2,auVar13);
      uVar105 = auVar12._0_4_;
      auVar175._4_4_ = uVar105;
      auVar175._0_4_ = uVar105;
      auVar175._8_4_ = uVar105;
      auVar175._12_4_ = uVar105;
      auVar11 = vshufps_avx(auVar12,auVar12,0x55);
      auVar12 = vshufps_avx(auVar12,auVar12,0xaa);
      auVar203._0_4_ = fVar133 * auVar12._0_4_;
      auVar203._4_4_ = fVar132 * auVar12._4_4_;
      auVar203._8_4_ = fVar166 * auVar12._8_4_;
      auVar203._12_4_ = fVar167 * auVar12._12_4_;
      auVar11 = vfmadd231ps_fma(auVar203,(undefined1  [16])aVar10,auVar11);
      auVar16 = vfmadd231ps_fma(auVar11,(undefined1  [16])aVar9,auVar175);
      auVar11 = vblendps_avx(auVar16,*pauVar2,8);
      auVar14 = vsubps_avx(*pauVar3,auVar13);
      uVar105 = auVar14._0_4_;
      auVar185._4_4_ = uVar105;
      auVar185._0_4_ = uVar105;
      auVar185._8_4_ = uVar105;
      auVar185._12_4_ = uVar105;
      auVar12 = vshufps_avx(auVar14,auVar14,0x55);
      auVar14 = vshufps_avx(auVar14,auVar14,0xaa);
      auVar207._0_4_ = fVar133 * auVar14._0_4_;
      auVar207._4_4_ = fVar132 * auVar14._4_4_;
      auVar207._8_4_ = fVar166 * auVar14._8_4_;
      auVar207._12_4_ = fVar167 * auVar14._12_4_;
      auVar12 = vfmadd231ps_fma(auVar207,(undefined1  [16])aVar10,auVar12);
      auVar107 = vfmadd231ps_fma(auVar12,(undefined1  [16])aVar9,auVar185);
      auVar12 = vblendps_avx(auVar107,*pauVar3,8);
      auVar14 = vsubps_avx(*pauVar4,auVar13);
      uVar105 = auVar14._0_4_;
      auVar186._4_4_ = uVar105;
      auVar186._0_4_ = uVar105;
      auVar186._8_4_ = uVar105;
      auVar186._12_4_ = uVar105;
      auVar13 = vshufps_avx(auVar14,auVar14,0x55);
      auVar14 = vshufps_avx(auVar14,auVar14,0xaa);
      auVar210._0_4_ = fVar133 * auVar14._0_4_;
      auVar210._4_4_ = fVar132 * auVar14._4_4_;
      auVar210._8_4_ = fVar166 * auVar14._8_4_;
      auVar210._12_4_ = fVar167 * auVar14._12_4_;
      auVar13 = vfmadd231ps_fma(auVar210,(undefined1  [16])aVar10,auVar13);
      auVar173 = vfmadd231ps_fma(auVar13,(undefined1  [16])aVar9,auVar186);
      auVar13 = vblendps_avx(auVar173,*pauVar4,8);
      auVar26._4_4_ = uStack_48c;
      auVar26._0_4_ = local_490;
      auVar26._8_4_ = uStack_488;
      auVar26._12_4_ = uStack_484;
      auVar150 = vandps_avx(auVar150,auVar26);
      auVar11 = vandps_avx(auVar11,auVar26);
      auVar14 = vmaxps_avx(auVar150,auVar11);
      auVar150 = vandps_avx(auVar12,auVar26);
      auVar11 = vandps_avx(auVar13,auVar26);
      auVar150 = vmaxps_avx(auVar150,auVar11);
      auVar150 = vmaxps_avx(auVar14,auVar150);
      auVar11 = vmovshdup_avx(auVar150);
      auVar11 = vmaxss_avx(auVar11,auVar150);
      auVar150 = vshufpd_avx(auVar150,auVar150,1);
      auVar150 = vmaxss_avx(auVar150,auVar11);
      lVar24 = (long)iVar96 * 0x44;
      auVar11 = vmovshdup_avx(auVar15);
      uVar106 = auVar11._0_8_;
      local_560._8_8_ = uVar106;
      local_560._0_8_ = uVar106;
      local_560._16_8_ = uVar106;
      local_560._24_8_ = uVar106;
      auVar120 = *(undefined1 (*) [32])(bspline_basis0 + lVar24 + 0x484);
      auVar11 = vmovshdup_avx(auVar16);
      uVar106 = auVar11._0_8_;
      local_580._8_8_ = uVar106;
      local_580._0_8_ = uVar106;
      local_580._16_8_ = uVar106;
      local_580._24_8_ = uVar106;
      auVar165 = *(undefined1 (*) [32])(bspline_basis0 + lVar24 + 0x908);
      uVar206 = auVar107._0_4_;
      local_600._4_4_ = uVar206;
      local_600._0_4_ = uVar206;
      local_600._8_4_ = uVar206;
      local_600._12_4_ = uVar206;
      local_600._16_4_ = uVar206;
      local_600._20_4_ = uVar206;
      local_600._24_4_ = uVar206;
      local_600._28_4_ = uVar206;
      auVar11 = vmovshdup_avx(auVar107);
      uVar106 = auVar11._0_8_;
      auVar159._8_8_ = uVar106;
      auVar159._0_8_ = uVar106;
      auVar159._16_8_ = uVar106;
      auVar159._24_8_ = uVar106;
      fVar132 = *(float *)*(undefined1 (*) [28])(bspline_basis0 + lVar24 + 0xd8c);
      fVar166 = *(float *)(bspline_basis0 + lVar24 + 0xd90);
      fVar167 = *(float *)(bspline_basis0 + lVar24 + 0xd94);
      fVar168 = *(float *)(bspline_basis0 + lVar24 + 0xd98);
      fVar169 = *(float *)(bspline_basis0 + lVar24 + 0xd9c);
      fVar170 = *(float *)(bspline_basis0 + lVar24 + 0xda0);
      fVar171 = *(float *)(bspline_basis0 + lVar24 + 0xda4);
      auVar93 = *(undefined1 (*) [28])(bspline_basis0 + lVar24 + 0xd8c);
      local_760 = auVar173._0_4_;
      auVar11 = vmovshdup_avx(auVar173);
      uVar106 = auVar11._0_8_;
      auVar176._0_4_ = fVar132 * local_760;
      auVar176._4_4_ = fVar166 * local_760;
      auVar176._8_4_ = fVar167 * local_760;
      auVar176._12_4_ = fVar168 * local_760;
      auVar176._16_4_ = fVar169 * local_760;
      auVar176._20_4_ = fVar170 * local_760;
      auVar176._24_4_ = fVar171 * local_760;
      auVar176._28_4_ = 0;
      fVar222 = auVar11._0_4_;
      auVar111._0_4_ = fVar222 * fVar132;
      fVar225 = auVar11._4_4_;
      auVar111._4_4_ = fVar225 * fVar166;
      auVar111._8_4_ = fVar222 * fVar167;
      auVar111._12_4_ = fVar225 * fVar168;
      auVar111._16_4_ = fVar222 * fVar169;
      auVar111._20_4_ = fVar225 * fVar170;
      auVar111._24_4_ = fVar222 * fVar171;
      auVar111._28_4_ = 0;
      auVar11 = vfmadd231ps_fma(auVar176,auVar165,local_600);
      auVar12 = vfmadd231ps_fma(auVar111,auVar165,auVar159);
      uVar105 = auVar16._0_4_;
      auVar219._4_4_ = uVar105;
      auVar219._0_4_ = uVar105;
      auVar219._8_4_ = uVar105;
      auVar219._12_4_ = uVar105;
      auVar219._16_4_ = uVar105;
      auVar219._20_4_ = uVar105;
      auVar219._24_4_ = uVar105;
      auVar219._28_4_ = uVar105;
      auVar11 = vfmadd231ps_fma(ZEXT1632(auVar11),auVar120,auVar219);
      auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),auVar120,local_580);
      auVar118 = *(undefined1 (*) [32])(bspline_basis0 + lVar24);
      uVar105 = auVar15._0_4_;
      auVar156._4_4_ = uVar105;
      auVar156._0_4_ = uVar105;
      auVar156._8_4_ = uVar105;
      auVar156._12_4_ = uVar105;
      auVar156._16_4_ = uVar105;
      auVar156._20_4_ = uVar105;
      auVar156._24_4_ = uVar105;
      auVar156._28_4_ = uVar105;
      auVar11 = vfmadd231ps_fma(ZEXT1632(auVar11),auVar118,auVar156);
      auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),auVar118,local_560);
      auVar128 = *(undefined1 (*) [32])(bspline_basis1 + lVar24 + 0x908);
      fVar209 = *(float *)*(undefined1 (*) [28])(bspline_basis1 + lVar24 + 0xd8c);
      fVar215 = *(float *)(bspline_basis1 + lVar24 + 0xd90);
      fVar82 = *(float *)(bspline_basis1 + lVar24 + 0xd94);
      fVar83 = *(float *)(bspline_basis1 + lVar24 + 0xd98);
      fVar84 = *(float *)(bspline_basis1 + lVar24 + 0xd9c);
      fVar85 = *(float *)(bspline_basis1 + lVar24 + 0xda0);
      fVar191 = *(float *)(bspline_basis1 + lVar24 + 0xda4);
      auVar94 = *(undefined1 (*) [28])(bspline_basis1 + lVar24 + 0xd8c);
      auVar27._4_4_ = fVar215 * local_760;
      auVar27._0_4_ = fVar209 * local_760;
      auVar27._8_4_ = fVar82 * local_760;
      auVar27._12_4_ = fVar83 * local_760;
      auVar27._16_4_ = fVar84 * local_760;
      auVar27._20_4_ = fVar85 * local_760;
      auVar27._24_4_ = fVar191 * local_760;
      auVar27._28_4_ = local_760;
      auVar13 = vfmadd231ps_fma(auVar27,auVar128,local_600);
      auVar28._4_4_ = fVar225 * fVar215;
      auVar28._0_4_ = fVar222 * fVar209;
      auVar28._8_4_ = fVar222 * fVar82;
      auVar28._12_4_ = fVar225 * fVar83;
      auVar28._16_4_ = fVar222 * fVar84;
      auVar28._20_4_ = fVar225 * fVar85;
      auVar28._24_4_ = fVar222 * fVar191;
      auVar28._28_4_ = uVar206;
      auVar14 = vfmadd231ps_fma(auVar28,auVar128,auVar159);
      auVar22 = *(undefined1 (*) [32])(bspline_basis1 + lVar24 + 0x484);
      auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar22,auVar219);
      auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar22,local_580);
      auVar161 = *(undefined1 (*) [32])(bspline_basis1 + lVar24);
      auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar161,auVar156);
      auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar161,local_560);
      auVar123 = ZEXT1632(auVar13);
      auVar177 = ZEXT1632(auVar11);
      auVar121 = vsubps_avx(auVar123,auVar177);
      auVar139 = ZEXT1632(auVar14);
      auVar112 = ZEXT1632(auVar12);
      auVar21 = vsubps_avx(auVar139,auVar112);
      auVar113._0_4_ = auVar12._0_4_ * auVar121._0_4_;
      auVar113._4_4_ = auVar12._4_4_ * auVar121._4_4_;
      auVar113._8_4_ = auVar12._8_4_ * auVar121._8_4_;
      auVar113._12_4_ = auVar12._12_4_ * auVar121._12_4_;
      auVar113._16_4_ = auVar121._16_4_ * 0.0;
      auVar113._20_4_ = auVar121._20_4_ * 0.0;
      auVar113._24_4_ = auVar121._24_4_ * 0.0;
      auVar113._28_4_ = 0;
      fVar197 = auVar21._0_4_;
      auVar124._0_4_ = fVar197 * auVar11._0_4_;
      fVar198 = auVar21._4_4_;
      auVar124._4_4_ = fVar198 * auVar11._4_4_;
      fVar199 = auVar21._8_4_;
      auVar124._8_4_ = fVar199 * auVar11._8_4_;
      fVar200 = auVar21._12_4_;
      auVar124._12_4_ = fVar200 * auVar11._12_4_;
      fVar201 = auVar21._16_4_;
      auVar124._16_4_ = fVar201 * 0.0;
      fVar202 = auVar21._20_4_;
      auVar124._20_4_ = fVar202 * 0.0;
      fVar221 = auVar21._24_4_;
      auVar124._24_4_ = fVar221 * 0.0;
      auVar124._28_4_ = 0;
      auVar138 = vsubps_avx(auVar113,auVar124);
      auVar11 = vpermilps_avx(*pauVar1,0xff);
      uVar122 = auVar11._0_8_;
      local_a0._8_8_ = uVar122;
      local_a0._0_8_ = uVar122;
      local_a0._16_8_ = uVar122;
      local_a0._24_8_ = uVar122;
      auVar12 = vpermilps_avx(*pauVar2,0xff);
      uVar122 = auVar12._0_8_;
      local_c0._8_8_ = uVar122;
      local_c0._0_8_ = uVar122;
      local_c0._16_8_ = uVar122;
      local_c0._24_8_ = uVar122;
      auVar12 = vpermilps_avx(*pauVar3,0xff);
      uVar122 = auVar12._0_8_;
      local_e0._8_8_ = uVar122;
      local_e0._0_8_ = uVar122;
      local_e0._16_8_ = uVar122;
      local_e0._24_8_ = uVar122;
      auVar12 = vpermilps_avx(*pauVar4,0xff);
      local_100 = auVar12._0_8_;
      fVar133 = auVar12._0_4_;
      auVar178._0_4_ = fVar132 * fVar133;
      fVar132 = auVar12._4_4_;
      auVar178._4_4_ = fVar166 * fVar132;
      auVar178._8_4_ = fVar167 * fVar133;
      auVar178._12_4_ = fVar168 * fVar132;
      auVar178._16_4_ = fVar169 * fVar133;
      auVar178._20_4_ = fVar170 * fVar132;
      auVar178._24_4_ = fVar171 * fVar133;
      auVar178._28_4_ = 0;
      auVar12 = vfmadd231ps_fma(auVar178,local_e0,auVar165);
      auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),local_c0,auVar120);
      auVar13 = vfmadd231ps_fma(ZEXT1632(auVar12),auVar118,local_a0);
      auVar184 = ZEXT1664(auVar13);
      uStack_f8 = local_100;
      uStack_f0 = local_100;
      uStack_e8 = local_100;
      auVar29._4_4_ = fVar215 * fVar132;
      auVar29._0_4_ = fVar209 * fVar133;
      auVar29._8_4_ = fVar82 * fVar133;
      auVar29._12_4_ = fVar83 * fVar132;
      auVar29._16_4_ = fVar84 * fVar133;
      auVar29._20_4_ = fVar85 * fVar132;
      auVar29._24_4_ = fVar191 * fVar133;
      auVar29._28_4_ = auVar118._28_4_;
      auVar12 = vfmadd231ps_fma(auVar29,auVar128,local_e0);
      auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),auVar22,local_c0);
      auVar14 = vfmadd231ps_fma(ZEXT1632(auVar12),auVar161,local_a0);
      auVar30._4_4_ = fVar198 * fVar198;
      auVar30._0_4_ = fVar197 * fVar197;
      auVar30._8_4_ = fVar199 * fVar199;
      auVar30._12_4_ = fVar200 * fVar200;
      auVar30._16_4_ = fVar201 * fVar201;
      auVar30._20_4_ = fVar202 * fVar202;
      auVar30._24_4_ = fVar221 * fVar221;
      auVar30._28_4_ = auVar11._4_4_;
      auVar11 = vfmadd231ps_fma(auVar30,auVar121,auVar121);
      auVar23 = vmaxps_avx(ZEXT1632(auVar13),ZEXT1632(auVar14));
      auVar31._4_4_ = auVar23._4_4_ * auVar23._4_4_ * auVar11._4_4_;
      auVar31._0_4_ = auVar23._0_4_ * auVar23._0_4_ * auVar11._0_4_;
      auVar31._8_4_ = auVar23._8_4_ * auVar23._8_4_ * auVar11._8_4_;
      auVar31._12_4_ = auVar23._12_4_ * auVar23._12_4_ * auVar11._12_4_;
      auVar31._16_4_ = auVar23._16_4_ * auVar23._16_4_ * 0.0;
      auVar31._20_4_ = auVar23._20_4_ * auVar23._20_4_ * 0.0;
      auVar31._24_4_ = auVar23._24_4_ * auVar23._24_4_ * 0.0;
      auVar31._28_4_ = auVar23._28_4_;
      auVar32._4_4_ = auVar138._4_4_ * auVar138._4_4_;
      auVar32._0_4_ = auVar138._0_4_ * auVar138._0_4_;
      auVar32._8_4_ = auVar138._8_4_ * auVar138._8_4_;
      auVar32._12_4_ = auVar138._12_4_ * auVar138._12_4_;
      auVar32._16_4_ = auVar138._16_4_ * auVar138._16_4_;
      auVar32._20_4_ = auVar138._20_4_ * auVar138._20_4_;
      auVar32._24_4_ = auVar138._24_4_ * auVar138._24_4_;
      auVar32._28_4_ = auVar138._28_4_;
      auVar23 = vcmpps_avx(auVar32,auVar31,2);
      fVar133 = auVar150._0_4_ * 4.7683716e-07;
      auVar114._0_4_ = (float)iVar96;
      local_520._4_12_ = auVar107._4_12_;
      local_520._0_4_ = auVar114._0_4_;
      local_520._16_16_ = auVar110._16_16_;
      auVar114._4_4_ = auVar114._0_4_;
      auVar114._8_4_ = auVar114._0_4_;
      auVar114._12_4_ = auVar114._0_4_;
      auVar114._16_4_ = auVar114._0_4_;
      auVar114._20_4_ = auVar114._0_4_;
      auVar114._24_4_ = auVar114._0_4_;
      auVar114._28_4_ = auVar114._0_4_;
      auVar110 = vcmpps_avx(_DAT_02020f40,auVar114,1);
      auVar150 = vpermilps_avx(auVar15,0xaa);
      uVar122 = auVar150._0_8_;
      local_620._8_8_ = uVar122;
      local_620._0_8_ = uVar122;
      local_620._16_8_ = uVar122;
      local_620._24_8_ = uVar122;
      auVar12 = vpermilps_avx(auVar16,0xaa);
      uVar122 = auVar12._0_8_;
      auVar217._8_8_ = uVar122;
      auVar217._0_8_ = uVar122;
      auVar217._16_8_ = uVar122;
      auVar217._24_8_ = uVar122;
      auVar150 = vshufps_avx(auVar107,auVar107,0xaa);
      uVar122 = auVar150._0_8_;
      auVar208._8_8_ = uVar122;
      auVar208._0_8_ = uVar122;
      auVar208._16_8_ = uVar122;
      auVar208._24_8_ = uVar122;
      auVar11 = vshufps_avx(auVar173,auVar173,0xaa);
      uVar122 = auVar11._0_8_;
      register0x00001508 = uVar122;
      local_6e0 = uVar122;
      register0x00001510 = uVar122;
      register0x00001518 = uVar122;
      auVar213 = ZEXT3264(_local_6e0);
      auVar138 = auVar110 & auVar23;
      uVar105 = *(undefined4 *)(ray + k * 4 + 0x60);
      fStack_75c = local_760;
      fStack_758 = local_760;
      fStack_754 = local_760;
      fStack_750 = local_760;
      fStack_74c = local_760;
      fStack_748 = local_760;
      fStack_744 = local_760;
      if ((((((((auVar138 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar138 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar138 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar138 >> 0x7f,0) == '\0') &&
            (auVar138 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar138 >> 0xbf,0) == '\0') &&
          (auVar138 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < auVar138[0x1f]) {
        bVar103 = false;
        auVar195 = ZEXT3264(CONCAT428(local_760,
                                      CONCAT424(local_760,
                                                CONCAT420(local_760,
                                                          CONCAT416(local_760,
                                                                    CONCAT412(local_760,
                                                                              CONCAT48(local_760,
                                                                                       CONCAT44(
                                                  local_760,local_760))))))));
        auVar131 = ZEXT3264(CONCAT428(fVar225,CONCAT424(fVar222,CONCAT420(fVar225,CONCAT416(fVar222,
                                                  CONCAT412(fVar225,CONCAT48(fVar222,uVar106)))))));
      }
      else {
        _local_4c0 = vandps_avx(auVar23,auVar110);
        local_6a0._0_4_ = auVar94._0_4_;
        local_6a0._4_4_ = auVar94._4_4_;
        fStack_698 = auVar94._8_4_;
        fStack_694 = auVar94._12_4_;
        fStack_690 = auVar94._16_4_;
        fStack_68c = auVar94._20_4_;
        fStack_688 = auVar94._24_4_;
        fVar209 = auVar11._0_4_;
        fVar215 = auVar11._4_4_;
        auVar33._4_4_ = fVar215 * (float)local_6a0._4_4_;
        auVar33._0_4_ = fVar209 * (float)local_6a0._0_4_;
        auVar33._8_4_ = fVar209 * fStack_698;
        auVar33._12_4_ = fVar215 * fStack_694;
        auVar33._16_4_ = fVar209 * fStack_690;
        auVar33._20_4_ = fVar215 * fStack_68c;
        auVar33._24_4_ = fVar209 * fStack_688;
        auVar33._28_4_ = local_4c0._28_4_;
        auVar11 = vfmadd213ps_fma(auVar128,auVar208,auVar33);
        auVar11 = vfmadd213ps_fma(auVar22,auVar217,ZEXT1632(auVar11));
        auVar11 = vfmadd213ps_fma(auVar161,local_620,ZEXT1632(auVar11));
        local_680._0_4_ = auVar93._0_4_;
        local_680._4_4_ = auVar93._4_4_;
        fStack_678 = auVar93._8_4_;
        fStack_674 = auVar93._12_4_;
        auStack_670._0_4_ = auVar93._16_4_;
        auStack_670._4_4_ = auVar93._20_4_;
        fStack_668 = auVar93._24_4_;
        auVar34._4_4_ = fVar215 * (float)local_680._4_4_;
        auVar34._0_4_ = fVar209 * (float)local_680._0_4_;
        auVar34._8_4_ = fVar209 * fStack_678;
        auVar34._12_4_ = fVar215 * fStack_674;
        auVar34._16_4_ = fVar209 * (float)auStack_670._0_4_;
        auVar34._20_4_ = fVar215 * (float)auStack_670._4_4_;
        auVar34._24_4_ = fVar209 * fStack_668;
        auVar34._28_4_ = local_4c0._28_4_;
        auVar15 = vfmadd213ps_fma(auVar165,auVar208,auVar34);
        auVar15 = vfmadd213ps_fma(auVar120,auVar217,ZEXT1632(auVar15));
        auVar110 = *(undefined1 (*) [32])(bspline_basis0 + lVar24 + 0x1210);
        auVar120 = *(undefined1 (*) [32])(bspline_basis0 + lVar24 + 0x1694);
        auVar165 = *(undefined1 (*) [32])(bspline_basis0 + lVar24 + 0x1b18);
        fVar132 = *(float *)(bspline_basis0 + lVar24 + 0x1f9c);
        fVar166 = *(float *)(bspline_basis0 + lVar24 + 0x1fa0);
        fVar167 = *(float *)(bspline_basis0 + lVar24 + 0x1fa4);
        fVar168 = *(float *)(bspline_basis0 + lVar24 + 0x1fa8);
        fVar169 = *(float *)(bspline_basis0 + lVar24 + 0x1fac);
        fVar170 = *(float *)(bspline_basis0 + lVar24 + 0x1fb0);
        fVar171 = *(float *)(bspline_basis0 + lVar24 + 0x1fb4);
        auVar160._0_4_ = fVar132 * local_760;
        auVar160._4_4_ = fVar166 * local_760;
        auVar160._8_4_ = fVar167 * local_760;
        auVar160._12_4_ = fVar168 * local_760;
        auVar160._16_4_ = fVar169 * local_760;
        auVar160._20_4_ = fVar170 * local_760;
        auVar160._24_4_ = fVar171 * local_760;
        auVar160._28_4_ = 0;
        auVar188._0_4_ = fVar222 * fVar132;
        auVar188._4_4_ = fVar225 * fVar166;
        auVar188._8_4_ = fVar222 * fVar167;
        auVar188._12_4_ = fVar225 * fVar168;
        auVar188._16_4_ = fVar222 * fVar169;
        auVar188._20_4_ = fVar225 * fVar170;
        auVar188._24_4_ = fVar222 * fVar171;
        auVar188._28_4_ = 0;
        auVar204._0_4_ = fVar209 * fVar132;
        auVar204._4_4_ = fVar215 * fVar166;
        auVar204._8_4_ = fVar209 * fVar167;
        auVar204._12_4_ = fVar215 * fVar168;
        auVar204._16_4_ = fVar209 * fVar169;
        auVar204._20_4_ = fVar215 * fVar170;
        auVar204._24_4_ = fVar209 * fVar171;
        auVar204._28_4_ = 0;
        auVar16 = vfmadd231ps_fma(auVar160,auVar165,local_600);
        auVar107 = vfmadd231ps_fma(auVar188,auVar165,auVar159);
        auVar173 = vfmadd231ps_fma(auVar204,auVar208,auVar165);
        auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar120,auVar219);
        auVar107 = vfmadd231ps_fma(ZEXT1632(auVar107),auVar120,local_580);
        auVar173 = vfmadd231ps_fma(ZEXT1632(auVar173),auVar217,auVar120);
        auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar110,auVar156);
        auVar107 = vfmadd231ps_fma(ZEXT1632(auVar107),auVar110,local_560);
        auVar173 = vfmadd231ps_fma(ZEXT1632(auVar173),auVar110,local_620);
        fVar132 = *(float *)(bspline_basis1 + lVar24 + 0x1f9c);
        fVar166 = *(float *)(bspline_basis1 + lVar24 + 0x1fa0);
        fVar167 = *(float *)(bspline_basis1 + lVar24 + 0x1fa4);
        fVar168 = *(float *)(bspline_basis1 + lVar24 + 0x1fa8);
        fVar169 = *(float *)(bspline_basis1 + lVar24 + 0x1fac);
        fVar170 = *(float *)(bspline_basis1 + lVar24 + 0x1fb0);
        fVar171 = *(float *)(bspline_basis1 + lVar24 + 0x1fb4);
        auVar35._4_4_ = local_760 * fVar166;
        auVar35._0_4_ = local_760 * fVar132;
        auVar35._8_4_ = local_760 * fVar167;
        auVar35._12_4_ = local_760 * fVar168;
        auVar35._16_4_ = local_760 * fVar169;
        auVar35._20_4_ = local_760 * fVar170;
        auVar35._24_4_ = local_760 * fVar171;
        auVar35._28_4_ = auVar12._4_4_;
        auVar36._4_4_ = fVar225 * fVar166;
        auVar36._0_4_ = fVar222 * fVar132;
        auVar36._8_4_ = fVar222 * fVar167;
        auVar36._12_4_ = fVar225 * fVar168;
        auVar36._16_4_ = fVar222 * fVar169;
        auVar36._20_4_ = fVar225 * fVar170;
        auVar36._24_4_ = fVar222 * fVar171;
        auVar36._28_4_ = fVar215;
        auVar37._4_4_ = fVar215 * fVar166;
        auVar37._0_4_ = fVar209 * fVar132;
        auVar37._8_4_ = fVar209 * fVar167;
        auVar37._12_4_ = fVar215 * fVar168;
        auVar37._16_4_ = fVar209 * fVar169;
        auVar37._20_4_ = fVar215 * fVar170;
        auVar37._24_4_ = fVar209 * fVar171;
        auVar37._28_4_ = auVar150._4_4_;
        auVar110 = *(undefined1 (*) [32])(bspline_basis1 + lVar24 + 0x1b18);
        auVar150 = vfmadd231ps_fma(auVar35,auVar110,local_600);
        auVar12 = vfmadd231ps_fma(auVar36,auVar110,auVar159);
        auVar26 = vfmadd231ps_fma(auVar37,auVar208,auVar110);
        auVar110 = *(undefined1 (*) [32])(bspline_basis1 + lVar24 + 0x1694);
        auVar150 = vfmadd231ps_fma(ZEXT1632(auVar150),auVar110,auVar219);
        auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),auVar110,local_580);
        auVar26 = vfmadd231ps_fma(ZEXT1632(auVar26),auVar110,auVar217);
        auVar110 = *(undefined1 (*) [32])(bspline_basis1 + lVar24 + 0x1210);
        auVar150 = vfmadd231ps_fma(ZEXT1632(auVar150),auVar110,auVar156);
        auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),auVar110,local_560);
        auVar26 = vfmadd231ps_fma(ZEXT1632(auVar26),local_620,auVar110);
        auVar110 = vandps_avx(local_2e0,ZEXT1632(auVar16));
        auVar120 = vandps_avx(ZEXT1632(auVar107),local_2e0);
        auVar120 = vmaxps_avx(auVar110,auVar120);
        auVar110 = vandps_avx(ZEXT1632(auVar173),local_2e0);
        auVar110 = vmaxps_avx(auVar120,auVar110);
        auVar125._4_4_ = fVar133;
        auVar125._0_4_ = fVar133;
        auVar125._8_4_ = fVar133;
        auVar125._12_4_ = fVar133;
        auVar125._16_4_ = fVar133;
        auVar125._20_4_ = fVar133;
        auVar125._24_4_ = fVar133;
        auVar125._28_4_ = fVar133;
        auVar110 = vcmpps_avx(auVar110,auVar125,1);
        auVar165 = vblendvps_avx(ZEXT1632(auVar16),auVar121,auVar110);
        auVar128 = vblendvps_avx(ZEXT1632(auVar107),auVar21,auVar110);
        auVar110 = vandps_avx(ZEXT1632(auVar150),local_2e0);
        auVar120 = vandps_avx(ZEXT1632(auVar12),local_2e0);
        auVar120 = vmaxps_avx(auVar110,auVar120);
        auVar110 = vandps_avx(ZEXT1632(auVar26),local_2e0);
        auVar110 = vmaxps_avx(auVar120,auVar110);
        auVar120 = vcmpps_avx(auVar110,auVar125,1);
        auVar110 = vblendvps_avx(ZEXT1632(auVar150),auVar121,auVar120);
        auVar120 = vblendvps_avx(ZEXT1632(auVar12),auVar21,auVar120);
        auVar150 = vfmadd213ps_fma(auVar118,local_620,ZEXT1632(auVar15));
        auVar12 = vfmadd213ps_fma(auVar165,auVar165,ZEXT832(0) << 0x20);
        auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),auVar128,auVar128);
        auVar118 = vrsqrtps_avx(ZEXT1632(auVar12));
        fVar132 = auVar118._0_4_;
        fVar166 = auVar118._4_4_;
        fVar167 = auVar118._8_4_;
        fVar168 = auVar118._12_4_;
        fVar169 = auVar118._16_4_;
        fVar170 = auVar118._20_4_;
        fVar171 = auVar118._24_4_;
        auVar38._4_4_ = fVar166 * fVar166 * fVar166 * auVar12._4_4_ * -0.5;
        auVar38._0_4_ = fVar132 * fVar132 * fVar132 * auVar12._0_4_ * -0.5;
        auVar38._8_4_ = fVar167 * fVar167 * fVar167 * auVar12._8_4_ * -0.5;
        auVar38._12_4_ = fVar168 * fVar168 * fVar168 * auVar12._12_4_ * -0.5;
        auVar38._16_4_ = fVar169 * fVar169 * fVar169 * -0.0;
        auVar38._20_4_ = fVar170 * fVar170 * fVar170 * -0.0;
        auVar38._24_4_ = fVar171 * fVar171 * fVar171 * -0.0;
        auVar38._28_4_ = 0;
        auVar220._8_4_ = 0x3fc00000;
        auVar220._0_8_ = 0x3fc000003fc00000;
        auVar220._12_4_ = 0x3fc00000;
        auVar220._16_4_ = 0x3fc00000;
        auVar220._20_4_ = 0x3fc00000;
        auVar220._24_4_ = 0x3fc00000;
        auVar220._28_4_ = 0x3fc00000;
        auVar12 = vfmadd231ps_fma(auVar38,auVar220,auVar118);
        fVar132 = auVar12._0_4_;
        fVar166 = auVar12._4_4_;
        auVar39._4_4_ = auVar128._4_4_ * fVar166;
        auVar39._0_4_ = auVar128._0_4_ * fVar132;
        fVar167 = auVar12._8_4_;
        auVar39._8_4_ = auVar128._8_4_ * fVar167;
        fVar168 = auVar12._12_4_;
        auVar39._12_4_ = auVar128._12_4_ * fVar168;
        auVar39._16_4_ = auVar128._16_4_ * 0.0;
        auVar39._20_4_ = auVar128._20_4_ * 0.0;
        auVar39._24_4_ = auVar128._24_4_ * 0.0;
        auVar39._28_4_ = auVar118._28_4_;
        auVar40._4_4_ = -auVar165._4_4_ * fVar166;
        auVar40._0_4_ = -auVar165._0_4_ * fVar132;
        auVar40._8_4_ = -auVar165._8_4_ * fVar167;
        auVar40._12_4_ = -auVar165._12_4_ * fVar168;
        auVar40._16_4_ = -auVar165._16_4_ * 0.0;
        auVar40._20_4_ = -auVar165._20_4_ * 0.0;
        auVar40._24_4_ = -auVar165._24_4_ * 0.0;
        auVar40._28_4_ = auVar165._28_4_ ^ 0x80000000;
        auVar12 = vfmadd213ps_fma(auVar110,auVar110,ZEXT832(0) << 0x20);
        auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),auVar120,auVar120);
        auVar165 = vrsqrtps_avx(ZEXT1632(auVar12));
        auVar118 = ZEXT1632(CONCAT412(fVar168 * 0.0,
                                      CONCAT48(fVar167 * 0.0,CONCAT44(fVar166 * 0.0,fVar132 * 0.0)))
                           );
        fVar132 = auVar165._0_4_;
        fVar166 = auVar165._4_4_;
        fVar167 = auVar165._8_4_;
        fVar168 = auVar165._12_4_;
        fVar169 = auVar165._16_4_;
        fVar170 = auVar165._20_4_;
        fVar171 = auVar165._24_4_;
        auVar41._4_4_ = fVar166 * fVar166 * auVar12._4_4_ * -0.5 * fVar166;
        auVar41._0_4_ = fVar132 * fVar132 * auVar12._0_4_ * -0.5 * fVar132;
        auVar41._8_4_ = fVar167 * fVar167 * auVar12._8_4_ * -0.5 * fVar167;
        auVar41._12_4_ = fVar168 * fVar168 * auVar12._12_4_ * -0.5 * fVar168;
        auVar41._16_4_ = fVar169 * fVar169 * fVar169 * -0.0;
        auVar41._20_4_ = fVar170 * fVar170 * fVar170 * -0.0;
        auVar41._24_4_ = fVar171 * fVar171 * fVar171 * -0.0;
        auVar41._28_4_ = 0xbf000000;
        auVar12 = vfmadd231ps_fma(auVar41,auVar220,auVar165);
        fVar132 = auVar12._0_4_;
        fVar166 = auVar12._4_4_;
        auVar42._4_4_ = fVar166 * auVar120._4_4_;
        auVar42._0_4_ = fVar132 * auVar120._0_4_;
        fVar167 = auVar12._8_4_;
        auVar42._8_4_ = fVar167 * auVar120._8_4_;
        fVar168 = auVar12._12_4_;
        auVar42._12_4_ = fVar168 * auVar120._12_4_;
        auVar42._16_4_ = auVar120._16_4_ * 0.0;
        auVar42._20_4_ = auVar120._20_4_ * 0.0;
        auVar42._24_4_ = auVar120._24_4_ * 0.0;
        auVar42._28_4_ = auVar21._28_4_;
        auVar43._4_4_ = fVar166 * -auVar110._4_4_;
        auVar43._0_4_ = fVar132 * -auVar110._0_4_;
        auVar43._8_4_ = fVar167 * -auVar110._8_4_;
        auVar43._12_4_ = fVar168 * -auVar110._12_4_;
        auVar43._16_4_ = -auVar110._16_4_ * 0.0;
        auVar43._20_4_ = -auVar110._20_4_ * 0.0;
        auVar43._24_4_ = -auVar110._24_4_ * 0.0;
        auVar43._28_4_ = 0;
        auVar44._28_4_ = auVar165._28_4_;
        auVar44._0_28_ =
             ZEXT1628(CONCAT412(fVar168 * 0.0,
                                CONCAT48(fVar167 * 0.0,CONCAT44(fVar166 * 0.0,fVar132 * 0.0))));
        auVar12 = vfmadd213ps_fma(auVar39,ZEXT1632(auVar13),auVar177);
        auVar110 = ZEXT1632(auVar13);
        auVar15 = vfmadd213ps_fma(auVar40,auVar110,auVar112);
        auVar16 = vfmadd213ps_fma(auVar118,auVar110,ZEXT1632(auVar150));
        auVar26 = vfnmadd213ps_fma(auVar39,auVar110,auVar177);
        auVar107 = vfmadd213ps_fma(auVar42,ZEXT1632(auVar14),auVar123);
        auVar149 = vfnmadd213ps_fma(auVar40,auVar110,auVar112);
        auVar110 = ZEXT1632(auVar14);
        auVar173 = vfmadd213ps_fma(auVar43,auVar110,auVar139);
        auVar179 = ZEXT1632(auVar13);
        auVar185 = vfnmadd231ps_fma(ZEXT1632(auVar150),auVar179,auVar118);
        auVar13 = vfmadd213ps_fma(auVar44,auVar110,ZEXT1632(auVar11));
        auVar174 = vfnmadd213ps_fma(auVar42,auVar110,auVar123);
        auVar175 = vfnmadd213ps_fma(auVar43,auVar110,auVar139);
        auVar186 = vfnmadd231ps_fma(ZEXT1632(auVar11),ZEXT1632(auVar14),auVar44);
        auVar110 = vsubps_avx(ZEXT1632(auVar173),ZEXT1632(auVar149));
        auVar120 = vsubps_avx(ZEXT1632(auVar13),ZEXT1632(auVar185));
        auVar140._0_4_ = auVar185._0_4_ * auVar110._0_4_;
        auVar140._4_4_ = auVar185._4_4_ * auVar110._4_4_;
        auVar140._8_4_ = auVar185._8_4_ * auVar110._8_4_;
        auVar140._12_4_ = auVar185._12_4_ * auVar110._12_4_;
        auVar140._16_4_ = auVar110._16_4_ * 0.0;
        auVar140._20_4_ = auVar110._20_4_ * 0.0;
        auVar140._24_4_ = auVar110._24_4_ * 0.0;
        auVar140._28_4_ = 0;
        auVar11 = vfmsub231ps_fma(auVar140,ZEXT1632(auVar149),auVar120);
        auVar45._4_4_ = auVar120._4_4_ * auVar26._4_4_;
        auVar45._0_4_ = auVar120._0_4_ * auVar26._0_4_;
        auVar45._8_4_ = auVar120._8_4_ * auVar26._8_4_;
        auVar45._12_4_ = auVar120._12_4_ * auVar26._12_4_;
        auVar45._16_4_ = auVar120._16_4_ * 0.0;
        auVar45._20_4_ = auVar120._20_4_ * 0.0;
        auVar45._24_4_ = auVar120._24_4_ * 0.0;
        auVar45._28_4_ = auVar120._28_4_;
        auVar120 = vsubps_avx(ZEXT1632(auVar107),ZEXT1632(auVar26));
        auVar150 = vfmsub231ps_fma(auVar45,ZEXT1632(auVar185),auVar120);
        auVar46._4_4_ = auVar149._4_4_ * auVar120._4_4_;
        auVar46._0_4_ = auVar149._0_4_ * auVar120._0_4_;
        auVar46._8_4_ = auVar149._8_4_ * auVar120._8_4_;
        auVar46._12_4_ = auVar149._12_4_ * auVar120._12_4_;
        auVar46._16_4_ = auVar120._16_4_ * 0.0;
        auVar46._20_4_ = auVar120._20_4_ * 0.0;
        auVar46._24_4_ = auVar120._24_4_ * 0.0;
        auVar46._28_4_ = auVar120._28_4_;
        auVar161 = ZEXT1632(auVar26);
        auVar26 = vfmsub231ps_fma(auVar46,auVar161,auVar110);
        auVar150 = vfmadd231ps_fma(ZEXT1632(auVar26),ZEXT832(0) << 0x20,ZEXT1632(auVar150));
        auVar150 = vfmadd231ps_fma(ZEXT1632(auVar150),ZEXT832(0) << 0x20,ZEXT1632(auVar11));
        auVar138 = vcmpps_avx(ZEXT1632(auVar150),ZEXT832(0) << 0x20,2);
        auVar110 = vblendvps_avx(ZEXT1632(auVar174),ZEXT1632(auVar12),auVar138);
        auVar120 = vblendvps_avx(ZEXT1632(auVar175),ZEXT1632(auVar15),auVar138);
        auVar165 = vblendvps_avx(ZEXT1632(auVar186),ZEXT1632(auVar16),auVar138);
        auVar118 = vblendvps_avx(auVar161,ZEXT1632(auVar107),auVar138);
        auVar128 = vblendvps_avx(ZEXT1632(auVar149),ZEXT1632(auVar173),auVar138);
        auVar184 = ZEXT3264(auVar128);
        auVar22 = vblendvps_avx(ZEXT1632(auVar185),ZEXT1632(auVar13),auVar138);
        auVar161 = vblendvps_avx(ZEXT1632(auVar107),auVar161,auVar138);
        auVar23 = vblendvps_avx(ZEXT1632(auVar173),ZEXT1632(auVar149),auVar138);
        auVar150 = vpackssdw_avx(local_4c0._0_16_,local_4c0._16_16_);
        auVar121 = vblendvps_avx(ZEXT1632(auVar13),ZEXT1632(auVar185),auVar138);
        auVar112 = vsubps_avx(auVar161,auVar110);
        auVar123 = vsubps_avx(auVar23,auVar120);
        auVar139 = vsubps_avx(auVar121,auVar165);
        auVar177 = vsubps_avx(auVar110,auVar118);
        auVar187 = vsubps_avx(auVar120,auVar128);
        auVar192 = vsubps_avx(auVar165,auVar22);
        auVar47._4_4_ = auVar139._4_4_ * auVar110._4_4_;
        auVar47._0_4_ = auVar139._0_4_ * auVar110._0_4_;
        auVar47._8_4_ = auVar139._8_4_ * auVar110._8_4_;
        auVar47._12_4_ = auVar139._12_4_ * auVar110._12_4_;
        auVar47._16_4_ = auVar139._16_4_ * auVar110._16_4_;
        auVar47._20_4_ = auVar139._20_4_ * auVar110._20_4_;
        auVar47._24_4_ = auVar139._24_4_ * auVar110._24_4_;
        auVar47._28_4_ = auVar121._28_4_;
        auVar11 = vfmsub231ps_fma(auVar47,auVar165,auVar112);
        auVar48._4_4_ = auVar120._4_4_ * auVar112._4_4_;
        auVar48._0_4_ = auVar120._0_4_ * auVar112._0_4_;
        auVar48._8_4_ = auVar120._8_4_ * auVar112._8_4_;
        auVar48._12_4_ = auVar120._12_4_ * auVar112._12_4_;
        auVar48._16_4_ = auVar120._16_4_ * auVar112._16_4_;
        auVar48._20_4_ = auVar120._20_4_ * auVar112._20_4_;
        auVar48._24_4_ = auVar120._24_4_ * auVar112._24_4_;
        auVar48._28_4_ = auVar161._28_4_;
        auVar12 = vfmsub231ps_fma(auVar48,auVar110,auVar123);
        auVar11 = vfmadd231ps_fma(ZEXT1632(auVar12),ZEXT832(0) << 0x20,ZEXT1632(auVar11));
        auVar115._0_4_ = auVar123._0_4_ * auVar165._0_4_;
        auVar115._4_4_ = auVar123._4_4_ * auVar165._4_4_;
        auVar115._8_4_ = auVar123._8_4_ * auVar165._8_4_;
        auVar115._12_4_ = auVar123._12_4_ * auVar165._12_4_;
        auVar115._16_4_ = auVar123._16_4_ * auVar165._16_4_;
        auVar115._20_4_ = auVar123._20_4_ * auVar165._20_4_;
        auVar115._24_4_ = auVar123._24_4_ * auVar165._24_4_;
        auVar115._28_4_ = 0;
        auVar12 = vfmsub231ps_fma(auVar115,auVar120,auVar139);
        auVar12 = vfmadd231ps_fma(ZEXT1632(auVar11),ZEXT832(0) << 0x20,ZEXT1632(auVar12));
        auVar116._0_4_ = auVar192._0_4_ * auVar118._0_4_;
        auVar116._4_4_ = auVar192._4_4_ * auVar118._4_4_;
        auVar116._8_4_ = auVar192._8_4_ * auVar118._8_4_;
        auVar116._12_4_ = auVar192._12_4_ * auVar118._12_4_;
        auVar116._16_4_ = auVar192._16_4_ * auVar118._16_4_;
        auVar116._20_4_ = auVar192._20_4_ * auVar118._20_4_;
        auVar116._24_4_ = auVar192._24_4_ * auVar118._24_4_;
        auVar116._28_4_ = 0;
        auVar11 = vfmsub231ps_fma(auVar116,auVar177,auVar22);
        auVar49._4_4_ = auVar187._4_4_ * auVar22._4_4_;
        auVar49._0_4_ = auVar187._0_4_ * auVar22._0_4_;
        auVar49._8_4_ = auVar187._8_4_ * auVar22._8_4_;
        auVar49._12_4_ = auVar187._12_4_ * auVar22._12_4_;
        auVar49._16_4_ = auVar187._16_4_ * auVar22._16_4_;
        auVar49._20_4_ = auVar187._20_4_ * auVar22._20_4_;
        auVar49._24_4_ = auVar187._24_4_ * auVar22._24_4_;
        auVar49._28_4_ = auVar22._28_4_;
        auVar13 = vfmsub231ps_fma(auVar49,auVar128,auVar192);
        auVar50._4_4_ = auVar177._4_4_ * auVar128._4_4_;
        auVar50._0_4_ = auVar177._0_4_ * auVar128._0_4_;
        auVar50._8_4_ = auVar177._8_4_ * auVar128._8_4_;
        auVar50._12_4_ = auVar177._12_4_ * auVar128._12_4_;
        auVar50._16_4_ = auVar177._16_4_ * auVar128._16_4_;
        auVar50._20_4_ = auVar177._20_4_ * auVar128._20_4_;
        auVar50._24_4_ = auVar177._24_4_ * auVar128._24_4_;
        auVar50._28_4_ = auVar23._28_4_;
        auVar15 = vfmsub231ps_fma(auVar50,auVar187,auVar118);
        auVar11 = vfmadd231ps_fma(ZEXT1632(auVar15),ZEXT832(0) << 0x20,ZEXT1632(auVar11));
        auVar13 = vfmadd231ps_fma(ZEXT1632(auVar11),ZEXT832(0) << 0x20,ZEXT1632(auVar13));
        auVar118 = vmaxps_avx(ZEXT1632(auVar12),ZEXT1632(auVar13));
        auVar118 = vcmpps_avx(auVar118,ZEXT832(0) << 0x20,2);
        auVar11 = vpackssdw_avx(auVar118._0_16_,auVar118._16_16_);
        auVar150 = vpand_avx(auVar11,auVar150);
        auVar118 = vpmovsxwd_avx2(auVar150);
        if ((((((((auVar118 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar118 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar118 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar118 >> 0x7f,0) == '\0') &&
              (auVar118 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar118 >> 0xbf,0) == '\0') &&
            (auVar118 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar118[0x1f]) {
LAB_018f9503:
          auVar213 = ZEXT3264(CONCAT824(uStack_588,
                                        CONCAT816(uStack_590,CONCAT88(uStack_598,local_5a0))));
        }
        else {
          auVar51._4_4_ = auVar123._4_4_ * auVar192._4_4_;
          auVar51._0_4_ = auVar123._0_4_ * auVar192._0_4_;
          auVar51._8_4_ = auVar123._8_4_ * auVar192._8_4_;
          auVar51._12_4_ = auVar123._12_4_ * auVar192._12_4_;
          auVar51._16_4_ = auVar123._16_4_ * auVar192._16_4_;
          auVar51._20_4_ = auVar123._20_4_ * auVar192._20_4_;
          auVar51._24_4_ = auVar123._24_4_ * auVar192._24_4_;
          auVar51._28_4_ = auVar118._28_4_;
          auVar107 = vfmsub231ps_fma(auVar51,auVar187,auVar139);
          auVar126._0_4_ = auVar139._0_4_ * auVar177._0_4_;
          auVar126._4_4_ = auVar139._4_4_ * auVar177._4_4_;
          auVar126._8_4_ = auVar139._8_4_ * auVar177._8_4_;
          auVar126._12_4_ = auVar139._12_4_ * auVar177._12_4_;
          auVar126._16_4_ = auVar139._16_4_ * auVar177._16_4_;
          auVar126._20_4_ = auVar139._20_4_ * auVar177._20_4_;
          auVar126._24_4_ = auVar139._24_4_ * auVar177._24_4_;
          auVar126._28_4_ = 0;
          auVar16 = vfmsub231ps_fma(auVar126,auVar112,auVar192);
          auVar52._4_4_ = auVar187._4_4_ * auVar112._4_4_;
          auVar52._0_4_ = auVar187._0_4_ * auVar112._0_4_;
          auVar52._8_4_ = auVar187._8_4_ * auVar112._8_4_;
          auVar52._12_4_ = auVar187._12_4_ * auVar112._12_4_;
          auVar52._16_4_ = auVar187._16_4_ * auVar112._16_4_;
          auVar52._20_4_ = auVar187._20_4_ * auVar112._20_4_;
          auVar52._24_4_ = auVar187._24_4_ * auVar112._24_4_;
          auVar52._28_4_ = auVar128._28_4_;
          auVar173 = vfmsub231ps_fma(auVar52,auVar177,auVar123);
          auVar11 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar16),ZEXT1632(auVar173));
          auVar15 = vfmadd231ps_fma(ZEXT1632(auVar11),ZEXT1632(auVar107),ZEXT832(0) << 0x20);
          auVar118 = vrcpps_avx(ZEXT1632(auVar15));
          auVar205._8_4_ = 0x3f800000;
          auVar205._0_8_ = &DAT_3f8000003f800000;
          auVar205._12_4_ = 0x3f800000;
          auVar205._16_4_ = 0x3f800000;
          auVar205._20_4_ = 0x3f800000;
          auVar205._24_4_ = 0x3f800000;
          auVar205._28_4_ = 0x3f800000;
          auVar11 = vfnmadd213ps_fma(auVar118,ZEXT1632(auVar15),auVar205);
          auVar11 = vfmadd132ps_fma(ZEXT1632(auVar11),auVar118,auVar118);
          auVar180._0_4_ = auVar173._0_4_ * auVar165._0_4_;
          auVar180._4_4_ = auVar173._4_4_ * auVar165._4_4_;
          auVar180._8_4_ = auVar173._8_4_ * auVar165._8_4_;
          auVar180._12_4_ = auVar173._12_4_ * auVar165._12_4_;
          auVar180._16_4_ = auVar165._16_4_ * 0.0;
          auVar180._20_4_ = auVar165._20_4_ * 0.0;
          auVar180._24_4_ = auVar165._24_4_ * 0.0;
          auVar180._28_4_ = 0;
          auVar16 = vfmadd231ps_fma(auVar180,auVar120,ZEXT1632(auVar16));
          auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),ZEXT1632(auVar107),auVar110);
          fVar132 = auVar11._0_4_;
          fVar166 = auVar11._4_4_;
          fVar167 = auVar11._8_4_;
          fVar168 = auVar11._12_4_;
          auVar165 = ZEXT1632(CONCAT412(fVar168 * auVar16._12_4_,
                                        CONCAT48(fVar167 * auVar16._8_4_,
                                                 CONCAT44(fVar166 * auVar16._4_4_,
                                                          fVar132 * auVar16._0_4_))));
          auVar184 = ZEXT3264(auVar165);
          auVar117._4_4_ = uVar105;
          auVar117._0_4_ = uVar105;
          auVar117._8_4_ = uVar105;
          auVar117._12_4_ = uVar105;
          auVar117._16_4_ = uVar105;
          auVar117._20_4_ = uVar105;
          auVar117._24_4_ = uVar105;
          auVar117._28_4_ = uVar105;
          uVar206 = *(undefined4 *)(ray + k * 4 + 0x100);
          auVar127._4_4_ = uVar206;
          auVar127._0_4_ = uVar206;
          auVar127._8_4_ = uVar206;
          auVar127._12_4_ = uVar206;
          auVar127._16_4_ = uVar206;
          auVar127._20_4_ = uVar206;
          auVar127._24_4_ = uVar206;
          auVar127._28_4_ = uVar206;
          auVar110 = vcmpps_avx(auVar117,auVar165,2);
          auVar120 = vcmpps_avx(auVar165,auVar127,2);
          auVar110 = vandps_avx(auVar120,auVar110);
          auVar11 = vpackssdw_avx(auVar110._0_16_,auVar110._16_16_);
          auVar150 = vpand_avx(auVar150,auVar11);
          auVar110 = vpmovsxwd_avx2(auVar150);
          if ((((((((auVar110 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar110 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar110 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar110 >> 0x7f,0) == '\0') &&
                (auVar110 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar110 >> 0xbf,0) == '\0') &&
              (auVar110 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar110[0x1f]) goto LAB_018f9503;
          auVar110 = vcmpps_avx(ZEXT832(0) << 0x20,ZEXT1632(auVar15),4);
          auVar11 = vpackssdw_avx(auVar110._0_16_,auVar110._16_16_);
          auVar150 = vpand_avx(auVar150,auVar11);
          auVar110 = vpmovsxwd_avx2(auVar150);
          auVar213 = ZEXT3264(CONCAT824(uStack_588,
                                        CONCAT816(uStack_590,CONCAT88(uStack_598,local_5a0))));
          if ((((((((auVar110 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar110 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar110 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar110 >> 0x7f,0) != '\0') ||
                (auVar110 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar110 >> 0xbf,0) != '\0') ||
              (auVar110 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar110[0x1f] < '\0') {
            auVar118 = ZEXT1632(CONCAT412(fVar168 * auVar12._12_4_,
                                          CONCAT48(fVar167 * auVar12._8_4_,
                                                   CONCAT44(fVar166 * auVar12._4_4_,
                                                            fVar132 * auVar12._0_4_))));
            auVar128 = ZEXT1632(CONCAT412(fVar168 * auVar13._12_4_,
                                          CONCAT48(fVar167 * auVar13._8_4_,
                                                   CONCAT44(fVar166 * auVar13._4_4_,
                                                            fVar132 * auVar13._0_4_))));
            auVar157._8_4_ = 0x3f800000;
            auVar157._0_8_ = &DAT_3f8000003f800000;
            auVar157._12_4_ = 0x3f800000;
            auVar157._16_4_ = 0x3f800000;
            auVar157._20_4_ = 0x3f800000;
            auVar157._24_4_ = 0x3f800000;
            auVar157._28_4_ = 0x3f800000;
            auVar120 = vsubps_avx(auVar157,auVar118);
            local_120 = vblendvps_avx(auVar120,auVar118,auVar138);
            auVar120 = vsubps_avx(auVar157,auVar128);
            local_4e0 = vblendvps_avx(auVar120,auVar128,auVar138);
            auVar213 = ZEXT3264(auVar110);
            local_2c0 = auVar165;
          }
        }
        auVar148 = ZEXT3264(auVar208);
        auVar110 = auVar213._0_32_;
        if ((((((((auVar110 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar110 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar110 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar110 >> 0x7f,0) != '\0') ||
              (auVar213 & (undefined1  [64])0x100000000) != (undefined1  [64])0x0) ||
             SUB321(auVar110 >> 0xbf,0) != '\0') ||
            (auVar213 & (undefined1  [64])0x100000000) != (undefined1  [64])0x0) ||
            auVar213[0x1f] < '\0') {
          auVar120 = vsubps_avx(ZEXT1632(auVar14),auVar179);
          auVar150 = vfmadd213ps_fma(auVar120,local_120,auVar179);
          fVar132 = *(float *)((long)pre->ray_space + k * 4 + -0x20);
          auVar53._4_4_ = (auVar150._4_4_ + auVar150._4_4_) * fVar132;
          auVar53._0_4_ = (auVar150._0_4_ + auVar150._0_4_) * fVar132;
          auVar53._8_4_ = (auVar150._8_4_ + auVar150._8_4_) * fVar132;
          auVar53._12_4_ = (auVar150._12_4_ + auVar150._12_4_) * fVar132;
          auVar53._16_4_ = fVar132 * 0.0;
          auVar53._20_4_ = fVar132 * 0.0;
          auVar53._24_4_ = fVar132 * 0.0;
          auVar53._28_4_ = 0;
          auVar120 = vcmpps_avx(local_2c0,auVar53,6);
          auVar165 = auVar110 & auVar120;
          auVar218 = ZEXT3264(auVar217);
          if ((((((((auVar165 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar165 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar165 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar165 >> 0x7f,0) != '\0') ||
                (auVar165 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar165 >> 0xbf,0) != '\0') ||
              (auVar165 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar165[0x1f] < '\0') {
            local_3c0 = vandps_avx(auVar120,auVar110);
            auVar129._8_4_ = 0xbf800000;
            auVar129._0_8_ = 0xbf800000bf800000;
            auVar129._12_4_ = 0xbf800000;
            auVar129._16_4_ = 0xbf800000;
            auVar129._20_4_ = 0xbf800000;
            auVar129._24_4_ = 0xbf800000;
            auVar129._28_4_ = 0xbf800000;
            auVar141._8_4_ = 0x40000000;
            auVar141._0_8_ = 0x4000000040000000;
            auVar141._12_4_ = 0x40000000;
            auVar141._16_4_ = 0x40000000;
            auVar141._20_4_ = 0x40000000;
            auVar141._24_4_ = 0x40000000;
            auVar141._28_4_ = 0x40000000;
            auVar150 = vfmadd213ps_fma(local_4e0,auVar141,auVar129);
            local_480 = local_120;
            local_460 = ZEXT1632(auVar150);
            local_440 = local_2c0;
            local_420 = 0;
            auVar213 = ZEXT3264(_local_6e0);
            local_4e0 = local_460;
            if ((pGVar18->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
              bVar103 = false;
              auVar131 = ZEXT3264(CONCAT428(fVar225,CONCAT424(fVar222,CONCAT420(fVar225,CONCAT416(
                                                  fVar222,CONCAT412(fVar225,CONCAT48(fVar222,uVar106
                                                                                    )))))));
              auVar195 = ZEXT3264(CONCAT428(local_760,
                                            CONCAT424(local_760,
                                                      CONCAT420(local_760,
                                                                CONCAT416(local_760,
                                                                          CONCAT412(local_760,
                                                                                    CONCAT48(
                                                  local_760,CONCAT44(local_760,local_760))))))));
            }
            else {
              auVar131 = ZEXT3264(CONCAT428(fVar225,CONCAT424(fVar222,CONCAT420(fVar225,CONCAT416(
                                                  fVar222,CONCAT412(fVar225,CONCAT48(fVar222,uVar106
                                                                                    )))))));
              auVar195 = ZEXT3264(CONCAT428(local_760,
                                            CONCAT424(local_760,
                                                      CONCAT420(local_760,
                                                                CONCAT416(local_760,
                                                                          CONCAT412(local_760,
                                                                                    CONCAT48(
                                                  local_760,CONCAT44(local_760,local_760))))))));
              if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                 (bVar103 = true, pGVar18->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                fVar132 = 1.0 / auVar114._0_4_;
                local_3a0[0] = fVar132 * (local_120._0_4_ + 0.0);
                local_3a0[1] = fVar132 * (local_120._4_4_ + 1.0);
                local_3a0[2] = fVar132 * (local_120._8_4_ + 2.0);
                local_3a0[3] = fVar132 * (local_120._12_4_ + 3.0);
                fStack_390 = fVar132 * (local_120._16_4_ + 4.0);
                fStack_38c = fVar132 * (local_120._20_4_ + 5.0);
                fStack_388 = fVar132 * (local_120._24_4_ + 6.0);
                fStack_384 = local_120._28_4_ + 7.0;
                local_4e0._0_8_ = auVar150._0_8_;
                local_4e0._8_8_ = auVar150._8_8_;
                local_380 = local_4e0._0_8_;
                uStack_378 = local_4e0._8_8_;
                uStack_370 = 0;
                uStack_368 = 0;
                local_360 = local_2c0._0_8_;
                uStack_358 = local_2c0._8_8_;
                uStack_350 = local_2c0._16_8_;
                uStack_348 = local_2c0._24_8_;
                uVar97 = vmovmskps_avx(local_3c0);
                bVar103 = uVar97 != 0;
                if (uVar97 == 0) {
                  auVar131 = ZEXT3264(CONCAT428(fVar225,CONCAT424(fVar222,CONCAT420(fVar225,
                                                  CONCAT416(fVar222,CONCAT412(fVar225,CONCAT48(
                                                  fVar222,uVar106)))))));
                }
                else {
                  uVar98 = 0;
                  uVar99 = (ulong)(uVar97 & 0xff);
                  for (uVar100 = uVar99; (uVar100 & 1) == 0;
                      uVar100 = uVar100 >> 1 | 0x8000000000000000) {
                    uVar98 = uVar98 + 1;
                  }
                  local_740._4_4_ = uVar95;
                  local_740._0_4_ = uVar95;
                  local_740._8_4_ = uVar95;
                  local_740._12_4_ = uVar95;
                  local_740._16_4_ = uVar95;
                  local_740._20_4_ = uVar95;
                  local_740._24_4_ = uVar95;
                  local_740._28_4_ = uVar95;
                  local_640._0_4_ = local_640._4_4_;
                  local_640._8_4_ = local_640._4_4_;
                  local_640._12_4_ = local_640._4_4_;
                  local_640._16_4_ = local_640._4_4_;
                  local_640._20_4_ = local_640._4_4_;
                  local_640._24_4_ = local_640._4_4_;
                  local_640._28_4_ = local_640._4_4_;
                  _local_660 = ZEXT1632(*pauVar2);
                  _auStack_670 = auVar21._16_16_;
                  _local_680 = *pauVar3;
                  _local_6a0 = ZEXT1632(*pauVar4);
                  local_780 = auVar208;
                  local_6c0 = auVar217;
                  local_41c = iVar96;
                  local_410 = uVar172;
                  uStack_408 = uVar86;
                  local_400 = local_6f0;
                  uStack_3f8 = uStack_6e8;
                  local_3f0 = local_700;
                  uStack_3e8 = uStack_6f8;
                  local_3e0 = local_710;
                  uStack_3d8 = uStack_708;
                  do {
                    uVar206 = *(undefined4 *)(ray + k * 4 + 0x100);
                    fVar132 = local_3a0[uVar98];
                    auVar108._4_4_ = fVar132;
                    auVar108._0_4_ = fVar132;
                    auVar108._8_4_ = fVar132;
                    auVar108._12_4_ = fVar132;
                    local_240._16_4_ = fVar132;
                    local_240._0_16_ = auVar108;
                    local_240._20_4_ = fVar132;
                    local_240._24_4_ = fVar132;
                    local_240._28_4_ = fVar132;
                    uVar8 = *(undefined4 *)((long)&local_380 + uVar98 * 4);
                    local_220._4_4_ = uVar8;
                    local_220._0_4_ = uVar8;
                    local_220._8_4_ = uVar8;
                    local_220._12_4_ = uVar8;
                    local_220._16_4_ = uVar8;
                    local_220._20_4_ = uVar8;
                    local_220._24_4_ = uVar8;
                    local_220._28_4_ = uVar8;
                    *(undefined4 *)(ray + k * 4 + 0x100) =
                         *(undefined4 *)((long)&local_360 + uVar98 * 4);
                    fVar167 = 1.0 - fVar132;
                    auVar150 = ZEXT416((uint)(fVar132 * fVar167 * 4.0));
                    auVar11 = vfnmsub213ss_fma(auVar108,auVar108,auVar150);
                    auVar150 = vfmadd213ss_fma(ZEXT416((uint)fVar167),ZEXT416((uint)fVar167),
                                               auVar150);
                    auVar184 = ZEXT464(0x3f000000);
                    fVar166 = auVar150._0_4_ * 0.5;
                    fVar132 = fVar132 * fVar132 * 0.5;
                    auVar151._0_4_ = fVar132 * (float)local_6a0._0_4_;
                    auVar151._4_4_ = fVar132 * (float)local_6a0._4_4_;
                    auVar151._8_4_ = fVar132 * fStack_698;
                    auVar151._12_4_ = fVar132 * fStack_694;
                    auVar134._4_4_ = fVar166;
                    auVar134._0_4_ = fVar166;
                    auVar134._8_4_ = fVar166;
                    auVar134._12_4_ = fVar166;
                    auVar150 = vfmadd132ps_fma(auVar134,auVar151,_local_680);
                    fVar132 = auVar11._0_4_ * 0.5;
                    auVar152._4_4_ = fVar132;
                    auVar152._0_4_ = fVar132;
                    auVar152._8_4_ = fVar132;
                    auVar152._12_4_ = fVar132;
                    auVar150 = vfmadd132ps_fma(auVar152,auVar150,_local_660);
                    local_7b0.context = context->user;
                    fVar132 = fVar167 * -fVar167 * 0.5;
                    auVar135._4_4_ = fVar132;
                    auVar135._0_4_ = fVar132;
                    auVar135._8_4_ = fVar132;
                    auVar135._12_4_ = fVar132;
                    auVar11 = vfmadd132ps_fma(auVar135,auVar150,auVar153);
                    local_2a0 = auVar11._0_4_;
                    uStack_29c = local_2a0;
                    uStack_298 = local_2a0;
                    uStack_294 = local_2a0;
                    uStack_290 = local_2a0;
                    uStack_28c = local_2a0;
                    uStack_288 = local_2a0;
                    uStack_284 = local_2a0;
                    auVar150 = vmovshdup_avx(auVar11);
                    local_280 = auVar150._0_8_;
                    uStack_278 = local_280;
                    uStack_270 = local_280;
                    uStack_268 = local_280;
                    auVar150 = vshufps_avx(auVar11,auVar11,0xaa);
                    local_260 = auVar150._0_8_;
                    uStack_258 = local_260;
                    uStack_250 = local_260;
                    uStack_248 = local_260;
                    local_200 = local_640._0_8_;
                    uStack_1f8 = local_640._8_8_;
                    uStack_1f0 = local_640._16_8_;
                    uStack_1e8 = local_640._24_8_;
                    local_1e0 = local_740;
                    auVar110 = vpcmpeqd_avx2(local_220,local_220);
                    local_1c0 = (local_7b0.context)->instID[0];
                    uStack_1bc = local_1c0;
                    uStack_1b8 = local_1c0;
                    uStack_1b4 = local_1c0;
                    uStack_1b0 = local_1c0;
                    uStack_1ac = local_1c0;
                    uStack_1a8 = local_1c0;
                    uStack_1a4 = local_1c0;
                    local_1a0 = (local_7b0.context)->instPrimID[0];
                    uStack_19c = local_1a0;
                    uStack_198 = local_1a0;
                    uStack_194 = local_1a0;
                    uStack_190 = local_1a0;
                    uStack_18c = local_1a0;
                    uStack_188 = local_1a0;
                    uStack_184 = local_1a0;
                    local_5e0 = local_300._0_8_;
                    uStack_5d8 = local_300._8_8_;
                    uStack_5d0 = local_300._16_8_;
                    uStack_5c8 = local_300._24_8_;
                    local_7b0.valid = (int *)&local_5e0;
                    local_7b0.geometryUserPtr = pGVar18->userPtr;
                    local_7b0.hit = (RTCHitN *)&local_2a0;
                    local_7b0.N = 8;
                    local_7b0.ray = (RTCRayN *)ray;
                    if (pGVar18->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                      auVar184 = ZEXT1664(auVar184._0_16_);
                      (*pGVar18->occlusionFilterN)(&local_7b0);
                      auVar131._8_56_ = extraout_var;
                      auVar131._0_8_ = extraout_XMM1_Qa;
                      auVar213 = ZEXT3264(_local_6e0);
                      auVar148 = ZEXT3264(local_780);
                      auVar218 = ZEXT3264(local_6c0);
                      auVar195 = ZEXT3264(CONCAT428(fStack_744,
                                                    CONCAT424(fStack_748,
                                                              CONCAT420(fStack_74c,
                                                                        CONCAT416(fStack_750,
                                                                                  CONCAT412(
                                                  fStack_754,
                                                  CONCAT48(fStack_758,CONCAT44(fStack_75c,local_760)
                                                          )))))));
                      auVar110 = vpcmpeqd_avx2(auVar131._0_32_,auVar131._0_32_);
                    }
                    auVar88._8_8_ = uStack_5d8;
                    auVar88._0_8_ = local_5e0;
                    auVar88._16_8_ = uStack_5d0;
                    auVar88._24_8_ = uStack_5c8;
                    auVar165 = vpcmpeqd_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar88);
                    auVar120 = auVar110 & ~auVar165;
                    if ((((((((auVar120 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                             (auVar120 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                            (auVar120 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                           SUB321(auVar120 >> 0x7f,0) == '\0') &&
                          (auVar120 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                         SUB321(auVar120 >> 0xbf,0) == '\0') &&
                        (auVar120 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                        -1 < auVar120[0x1f]) {
                      auVar165 = auVar165 ^ auVar110;
                    }
                    else {
                      p_Var19 = context->args->filter;
                      if ((p_Var19 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar18->field_8).field_0x2 & 0x40) != 0)))) {
                        auVar184 = ZEXT1664(auVar184._0_16_);
                        (*p_Var19)(&local_7b0);
                        auVar213 = ZEXT3264(_local_6e0);
                        auVar148 = ZEXT3264(local_780);
                        auVar218 = ZEXT3264(local_6c0);
                        auVar195 = ZEXT3264(CONCAT428(fStack_744,
                                                      CONCAT424(fStack_748,
                                                                CONCAT420(fStack_74c,
                                                                          CONCAT416(fStack_750,
                                                                                    CONCAT412(
                                                  fStack_754,
                                                  CONCAT48(fStack_758,CONCAT44(fStack_75c,local_760)
                                                          )))))));
                      }
                      auVar89._8_8_ = uStack_5d8;
                      auVar89._0_8_ = local_5e0;
                      auVar89._16_8_ = uStack_5d0;
                      auVar89._24_8_ = uStack_5c8;
                      auVar120 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
                      auVar110 = vpcmpeqd_avx2(auVar120,auVar89);
                      auVar165 = vpcmpeqd_avx2(auVar120,auVar120);
                      auVar165 = auVar110 ^ auVar165;
                      auVar142._8_4_ = 0xff800000;
                      auVar142._0_8_ = 0xff800000ff800000;
                      auVar142._12_4_ = 0xff800000;
                      auVar142._16_4_ = 0xff800000;
                      auVar142._20_4_ = 0xff800000;
                      auVar142._24_4_ = 0xff800000;
                      auVar142._28_4_ = 0xff800000;
                      auVar110 = vblendvps_avx(auVar142,*(undefined1 (*) [32])
                                                         (local_7b0.ray + 0x100),auVar110);
                      *(undefined1 (*) [32])(local_7b0.ray + 0x100) = auVar110;
                    }
                    auVar217 = auVar218._0_32_;
                    auVar208 = auVar148._0_32_;
                    auVar131 = ZEXT3264(CONCAT428(fVar225,CONCAT424(fVar222,CONCAT420(fVar225,
                                                  CONCAT416(fVar222,CONCAT412(fVar225,CONCAT48(
                                                  fVar222,uVar106)))))));
                    if ((((((((auVar165 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                             (auVar165 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar165 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           SUB321(auVar165 >> 0x7f,0) != '\0') ||
                          (auVar165 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                         SUB321(auVar165 >> 0xbf,0) != '\0') ||
                        (auVar165 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                        auVar165[0x1f] < '\0') break;
                    *(undefined4 *)(ray + k * 4 + 0x100) = uVar206;
                    uVar100 = uVar98 & 0x3f;
                    uVar98 = 0;
                    uVar99 = uVar99 ^ 1L << uVar100;
                    for (uVar100 = uVar99; (uVar100 & 1) == 0;
                        uVar100 = uVar100 >> 1 | 0x8000000000000000) {
                      uVar98 = uVar98 + 1;
                    }
                    bVar103 = uVar99 != 0;
                  } while (bVar103);
                }
                local_640._4_4_ = (uint)local_540;
              }
            }
            goto LAB_018f80d6;
          }
        }
        bVar103 = false;
        auVar195 = ZEXT3264(CONCAT428(local_760,
                                      CONCAT424(local_760,
                                                CONCAT420(local_760,
                                                          CONCAT416(local_760,
                                                                    CONCAT412(local_760,
                                                                              CONCAT48(local_760,
                                                                                       CONCAT44(
                                                  local_760,local_760))))))));
        auVar131 = ZEXT3264(CONCAT428(fVar225,CONCAT424(fVar222,CONCAT420(fVar225,CONCAT416(fVar222,
                                                  CONCAT412(fVar225,CONCAT48(fVar222,uVar106)))))));
        auVar213 = ZEXT3264(_local_6e0);
      }
LAB_018f80d6:
      local_540._0_4_ = local_640._4_4_;
      auVar148 = ZEXT3264(local_600);
      if (8 < iVar96) {
        local_6a0._4_4_ = iVar96;
        local_6a0._0_4_ = iVar96;
        fStack_698 = (float)iVar96;
        fStack_694 = (float)iVar96;
        fStack_690 = (float)iVar96;
        fStack_68c = (float)iVar96;
        fStack_688 = (float)iVar96;
        iStack_684 = iVar96;
        local_4c0._4_4_ = fVar133;
        local_4c0._0_4_ = fVar133;
        fStack_4b8 = fVar133;
        fStack_4b4 = fVar133;
        fStack_4b0 = fVar133;
        fStack_4ac = fVar133;
        fStack_4a8 = fVar133;
        fStack_4a4 = fVar133;
        local_140 = uVar105;
        uStack_13c = uVar105;
        uStack_138 = uVar105;
        uStack_134 = uVar105;
        uStack_130 = uVar105;
        uStack_12c = uVar105;
        uStack_128 = uVar105;
        uStack_124 = uVar105;
        local_180 = 1.0 / (float)local_520._0_4_;
        fStack_17c = local_180;
        fStack_178 = local_180;
        fStack_174 = local_180;
        fStack_170 = local_180;
        fStack_16c = local_180;
        fStack_168 = local_180;
        fStack_164 = local_180;
        local_160 = uVar95;
        uStack_15c = uVar95;
        uStack_158 = uVar95;
        uStack_154 = uVar95;
        uStack_150 = uVar95;
        uStack_14c = uVar95;
        uStack_148 = uVar95;
        uStack_144 = uVar95;
        local_540 = CONCAT44((uint)local_540,(uint)local_540);
        uStack_538 = (uint)local_540;
        uStack_534 = (uint)local_540;
        uStack_530 = (uint)local_540;
        uStack_52c = (uint)local_540;
        uStack_528 = (uint)local_540;
        uStack_524 = (uint)local_540;
        lVar101 = 8;
        _local_6e0 = auVar213._0_32_;
        local_780 = auVar208;
        local_6c0 = auVar217;
        do {
          auVar110 = *(undefined1 (*) [32])(bspline_basis0 + lVar101 * 4 + lVar24);
          auVar120 = *(undefined1 (*) [32])(lVar24 + 0x222bfac + lVar101 * 4);
          auVar165 = *(undefined1 (*) [32])(lVar24 + 0x222c430 + lVar101 * 4);
          pauVar5 = (undefined1 (*) [28])(lVar24 + 0x222c8b4 + lVar101 * 4);
          auVar93 = *pauVar5;
          fVar191 = auVar195._0_4_;
          auVar214._0_4_ = fVar191 * *(float *)*pauVar5;
          fVar197 = auVar195._4_4_;
          auVar214._4_4_ = fVar197 * *(float *)(*pauVar5 + 4);
          fVar198 = auVar195._8_4_;
          auVar214._8_4_ = fVar198 * *(float *)(*pauVar5 + 8);
          fVar199 = auVar195._12_4_;
          auVar214._12_4_ = fVar199 * *(float *)(*pauVar5 + 0xc);
          fVar200 = auVar195._16_4_;
          auVar214._16_4_ = fVar200 * *(float *)(*pauVar5 + 0x10);
          fVar201 = auVar195._20_4_;
          auVar214._20_4_ = fVar201 * *(float *)(*pauVar5 + 0x14);
          fVar202 = auVar195._24_4_;
          auVar214._28_36_ = auVar213._28_36_;
          auVar214._24_4_ = fVar202 * *(float *)(*pauVar5 + 0x18);
          auVar54._4_4_ = auVar131._4_4_ * *(float *)(*pauVar5 + 4);
          auVar54._0_4_ = auVar131._0_4_ * *(float *)*pauVar5;
          auVar54._8_4_ = auVar131._8_4_ * *(float *)(*pauVar5 + 8);
          auVar54._12_4_ = auVar131._12_4_ * *(float *)(*pauVar5 + 0xc);
          auVar54._16_4_ = auVar131._16_4_ * *(float *)(*pauVar5 + 0x10);
          auVar54._20_4_ = auVar131._20_4_ * *(float *)(*pauVar5 + 0x14);
          auVar54._24_4_ = auVar131._24_4_ * *(float *)(*pauVar5 + 0x18);
          auVar54._28_4_ = *(undefined4 *)pauVar5[1];
          auVar153 = vfmadd231ps_fma(auVar214._0_32_,auVar165,auVar148._0_32_);
          auVar150 = vfmadd231ps_fma(auVar54,auVar165,auVar159);
          auVar153 = vfmadd231ps_fma(ZEXT1632(auVar153),auVar120,auVar219);
          auVar150 = vfmadd231ps_fma(ZEXT1632(auVar150),auVar120,local_580);
          auVar153 = vfmadd231ps_fma(ZEXT1632(auVar153),auVar110,auVar156);
          auVar150 = vfmadd231ps_fma(ZEXT1632(auVar150),auVar110,local_560);
          auVar118 = *(undefined1 (*) [32])(bspline_basis1 + lVar101 * 4 + lVar24);
          auVar128 = *(undefined1 (*) [32])(lVar24 + 0x222e3cc + lVar101 * 4);
          auVar22 = *(undefined1 (*) [32])(lVar24 + 0x222e850 + lVar101 * 4);
          pauVar6 = (undefined1 (*) [32])(lVar24 + 0x222ecd4 + lVar101 * 4);
          fVar171 = *(float *)*pauVar6;
          fVar209 = *(float *)(*pauVar6 + 4);
          fVar215 = *(float *)(*pauVar6 + 8);
          fVar82 = *(float *)(*pauVar6 + 0xc);
          fVar83 = *(float *)(*pauVar6 + 0x10);
          fVar84 = *(float *)(*pauVar6 + 0x14);
          fVar85 = *(float *)(*pauVar6 + 0x18);
          auVar94 = *(undefined1 (*) [28])*pauVar6;
          auVar55._4_4_ = fVar197 * fVar209;
          auVar55._0_4_ = fVar191 * fVar171;
          auVar55._8_4_ = fVar198 * fVar215;
          auVar55._12_4_ = fVar199 * fVar82;
          auVar55._16_4_ = fVar200 * fVar83;
          auVar55._20_4_ = fVar201 * fVar84;
          auVar55._24_4_ = fVar202 * fVar85;
          auVar55._28_4_ = auVar165._28_4_;
          auVar218._0_4_ = auVar131._0_4_ * fVar171;
          auVar218._4_4_ = auVar131._4_4_ * fVar209;
          auVar218._8_4_ = auVar131._8_4_ * fVar215;
          auVar218._12_4_ = auVar131._12_4_ * fVar82;
          auVar218._16_4_ = auVar131._16_4_ * fVar83;
          auVar218._20_4_ = auVar131._20_4_ * fVar84;
          auVar218._28_36_ = auVar184._28_36_;
          auVar218._24_4_ = auVar131._24_4_ * fVar85;
          auVar11 = vfmadd231ps_fma(auVar55,auVar22,auVar148._0_32_);
          auVar12 = vfmadd231ps_fma(auVar218._0_32_,auVar22,auVar159);
          auVar11 = vfmadd231ps_fma(ZEXT1632(auVar11),auVar128,auVar219);
          auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),auVar128,local_580);
          auVar11 = vfmadd231ps_fma(ZEXT1632(auVar11),auVar118,auVar156);
          auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),auVar118,local_560);
          auVar139 = ZEXT1632(auVar11);
          auVar177 = ZEXT1632(auVar153);
          auVar23 = vsubps_avx(auVar139,auVar177);
          auVar123 = ZEXT1632(auVar12);
          auVar112 = ZEXT1632(auVar150);
          auVar121 = vsubps_avx(auVar123,auVar112);
          auVar81._4_4_ = auVar23._4_4_ * auVar150._4_4_;
          auVar81._0_4_ = auVar23._0_4_ * auVar150._0_4_;
          auVar81._8_4_ = auVar23._8_4_ * auVar150._8_4_;
          auVar81._12_4_ = auVar23._12_4_ * auVar150._12_4_;
          auVar81._16_4_ = auVar23._16_4_ * 0.0;
          auVar81._20_4_ = auVar23._20_4_ * 0.0;
          auVar81._24_4_ = auVar23._24_4_ * 0.0;
          auVar81._28_4_ = local_580._28_4_;
          fVar133 = auVar121._0_4_;
          auVar148._0_4_ = auVar153._0_4_ * fVar133;
          fVar132 = auVar121._4_4_;
          auVar148._4_4_ = auVar153._4_4_ * fVar132;
          fVar166 = auVar121._8_4_;
          auVar148._8_4_ = auVar153._8_4_ * fVar166;
          fVar167 = auVar121._12_4_;
          auVar148._12_4_ = auVar153._12_4_ * fVar167;
          fVar168 = auVar121._16_4_;
          auVar148._16_4_ = fVar168 * 0.0;
          fVar169 = auVar121._20_4_;
          auVar148._20_4_ = fVar169 * 0.0;
          fVar170 = auVar121._24_4_;
          auVar148._28_36_ = auVar131._28_36_;
          auVar148._24_4_ = fVar170 * 0.0;
          auVar213 = ZEXT3264(auVar165);
          auVar21 = vsubps_avx(auVar81,auVar148._0_32_);
          local_8e0 = auVar93._0_4_;
          fStack_8dc = auVar93._4_4_;
          fStack_8d8 = auVar93._8_4_;
          fStack_8d4 = auVar93._12_4_;
          fStack_8d0 = auVar93._16_4_;
          fStack_8cc = auVar93._20_4_;
          fStack_8c8 = auVar93._24_4_;
          auVar181._0_4_ = (float)local_100 * local_8e0;
          auVar181._4_4_ = local_100._4_4_ * fStack_8dc;
          auVar181._8_4_ = (float)uStack_f8 * fStack_8d8;
          auVar181._12_4_ = uStack_f8._4_4_ * fStack_8d4;
          auVar181._16_4_ = (float)uStack_f0 * fStack_8d0;
          auVar181._20_4_ = uStack_f0._4_4_ * fStack_8cc;
          auVar181._24_4_ = (float)uStack_e8 * fStack_8c8;
          auVar181._28_4_ = 0;
          auVar153 = vfmadd231ps_fma(auVar181,auVar165,local_e0);
          auVar153 = vfmadd231ps_fma(ZEXT1632(auVar153),local_c0,auVar120);
          auVar153 = vfmadd231ps_fma(ZEXT1632(auVar153),local_a0,auVar110);
          auVar184 = ZEXT1664(auVar153);
          auVar56._4_4_ = local_100._4_4_ * fVar209;
          auVar56._0_4_ = (float)local_100 * fVar171;
          auVar56._8_4_ = (float)uStack_f8 * fVar215;
          auVar56._12_4_ = uStack_f8._4_4_ * fVar82;
          auVar56._16_4_ = (float)uStack_f0 * fVar83;
          auVar56._20_4_ = uStack_f0._4_4_ * fVar84;
          auVar56._24_4_ = (float)uStack_e8 * fVar85;
          auVar56._28_4_ = uStack_e8._4_4_;
          auVar150 = vfmadd231ps_fma(auVar56,auVar22,local_e0);
          auVar150 = vfmadd231ps_fma(ZEXT1632(auVar150),auVar128,local_c0);
          auVar150 = vfmadd231ps_fma(ZEXT1632(auVar150),auVar118,local_a0);
          auVar196._0_4_ = fVar133 * fVar133;
          auVar196._4_4_ = fVar132 * fVar132;
          auVar196._8_4_ = fVar166 * fVar166;
          auVar196._12_4_ = fVar167 * fVar167;
          auVar196._16_4_ = fVar168 * fVar168;
          auVar196._20_4_ = fVar169 * fVar169;
          auVar196._28_36_ = auVar195._28_36_;
          auVar196._24_4_ = fVar170 * fVar170;
          auVar11 = vfmadd231ps_fma(auVar196._0_32_,auVar23,auVar23);
          auVar161 = vmaxps_avx(ZEXT1632(auVar153),ZEXT1632(auVar150));
          auVar193._0_4_ = auVar161._0_4_ * auVar161._0_4_ * auVar11._0_4_;
          auVar193._4_4_ = auVar161._4_4_ * auVar161._4_4_ * auVar11._4_4_;
          auVar193._8_4_ = auVar161._8_4_ * auVar161._8_4_ * auVar11._8_4_;
          auVar193._12_4_ = auVar161._12_4_ * auVar161._12_4_ * auVar11._12_4_;
          auVar193._16_4_ = auVar161._16_4_ * auVar161._16_4_ * 0.0;
          auVar193._20_4_ = auVar161._20_4_ * auVar161._20_4_ * 0.0;
          auVar193._24_4_ = auVar161._24_4_ * auVar161._24_4_ * 0.0;
          auVar193._28_4_ = 0;
          auVar57._4_4_ = auVar21._4_4_ * auVar21._4_4_;
          auVar57._0_4_ = auVar21._0_4_ * auVar21._0_4_;
          auVar57._8_4_ = auVar21._8_4_ * auVar21._8_4_;
          auVar57._12_4_ = auVar21._12_4_ * auVar21._12_4_;
          auVar57._16_4_ = auVar21._16_4_ * auVar21._16_4_;
          auVar57._20_4_ = auVar21._20_4_ * auVar21._20_4_;
          auVar57._24_4_ = auVar21._24_4_ * auVar21._24_4_;
          auVar57._28_4_ = auVar21._28_4_;
          auVar161 = vcmpps_avx(auVar57,auVar193,2);
          local_420 = (int)lVar101;
          auVar194._4_4_ = local_420;
          auVar194._0_4_ = local_420;
          auVar194._8_4_ = local_420;
          auVar194._12_4_ = local_420;
          auVar194._16_4_ = local_420;
          auVar194._20_4_ = local_420;
          auVar194._24_4_ = local_420;
          auVar194._28_4_ = local_420;
          auVar21 = vpor_avx2(auVar194,_DAT_0205a920);
          auVar138 = vpcmpgtd_avx2(_local_6a0,auVar21);
          auVar21 = auVar138 & auVar161;
          if ((((((((auVar21 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar21 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar21 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar21 >> 0x7f,0) == '\0') &&
                (auVar21 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar21 >> 0xbf,0) == '\0') &&
              (auVar21 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar21[0x1f]) {
            auVar148 = ZEXT3264(local_600);
            auVar195 = ZEXT3264(auVar195._0_32_);
            auVar131 = ZEXT3264(CONCAT428(fVar225,CONCAT424(fVar222,CONCAT420(fVar225,CONCAT416(
                                                  fVar222,CONCAT412(fVar225,CONCAT48(fVar222,uVar106
                                                                                    )))))));
          }
          else {
            local_520 = vandps_avx(auVar138,auVar161);
            local_680._0_4_ = auVar94._0_4_;
            local_680._4_4_ = auVar94._4_4_;
            fStack_678 = auVar94._8_4_;
            fStack_674 = auVar94._12_4_;
            auStack_670._0_4_ = auVar94._16_4_;
            auStack_670._4_4_ = auVar94._20_4_;
            fStack_668 = auVar94._24_4_;
            auVar58._4_4_ = (float)local_6e0._4_4_ * (float)local_680._4_4_;
            auVar58._0_4_ = (float)local_6e0._0_4_ * (float)local_680._0_4_;
            auVar58._8_4_ = fStack_6d8 * fStack_678;
            auVar58._12_4_ = fStack_6d4 * fStack_674;
            auVar58._16_4_ = fStack_6d0 * (float)auStack_670._0_4_;
            auVar58._20_4_ = fStack_6cc * (float)auStack_670._4_4_;
            auVar58._24_4_ = fStack_6c8 * fStack_668;
            auVar58._28_4_ = auVar161._28_4_;
            auVar11 = vfmadd213ps_fma(auVar22,local_780,auVar58);
            auVar11 = vfmadd213ps_fma(auVar128,local_6c0,ZEXT1632(auVar11));
            auVar11 = vfmadd132ps_fma(auVar118,ZEXT1632(auVar11),local_620);
            auVar59._4_4_ = (float)local_6e0._4_4_ * fStack_8dc;
            auVar59._0_4_ = (float)local_6e0._0_4_ * local_8e0;
            auVar59._8_4_ = fStack_6d8 * fStack_8d8;
            auVar59._12_4_ = fStack_6d4 * fStack_8d4;
            auVar59._16_4_ = fStack_6d0 * fStack_8d0;
            auVar59._20_4_ = fStack_6cc * fStack_8cc;
            auVar59._24_4_ = fStack_6c8 * fStack_8c8;
            auVar59._28_4_ = auVar161._28_4_;
            auVar12 = vfmadd213ps_fma(auVar165,local_780,auVar59);
            auVar12 = vfmadd213ps_fma(auVar120,local_6c0,ZEXT1632(auVar12));
            auVar120 = *(undefined1 (*) [32])(lVar24 + 0x222cd38 + lVar101 * 4);
            auVar165 = *(undefined1 (*) [32])(lVar24 + 0x222d1bc + lVar101 * 4);
            auVar118 = *(undefined1 (*) [32])(lVar24 + 0x222d640 + lVar101 * 4);
            pfVar7 = (float *)(lVar24 + 0x222dac4 + lVar101 * 4);
            fVar133 = *pfVar7;
            fVar132 = pfVar7[1];
            fVar166 = pfVar7[2];
            fVar167 = pfVar7[3];
            fVar168 = pfVar7[4];
            fVar169 = pfVar7[5];
            fVar170 = pfVar7[6];
            auVar189._0_4_ = fVar133 * fVar191;
            auVar189._4_4_ = fVar132 * fVar197;
            auVar189._8_4_ = fVar166 * fVar198;
            auVar189._12_4_ = fVar167 * fVar199;
            auVar189._16_4_ = fVar168 * fVar200;
            auVar189._20_4_ = fVar169 * fVar201;
            auVar189._24_4_ = fVar170 * fVar202;
            auVar189._28_4_ = 0;
            auVar211._0_4_ = fVar222 * fVar133;
            auVar211._4_4_ = fVar225 * fVar132;
            auVar211._8_4_ = fVar222 * fVar166;
            auVar211._12_4_ = fVar225 * fVar167;
            auVar211._16_4_ = fVar222 * fVar168;
            auVar211._20_4_ = fVar225 * fVar169;
            auVar211._24_4_ = fVar222 * fVar170;
            auVar211._28_4_ = 0;
            auVar60._4_4_ = fVar132 * (float)local_6e0._4_4_;
            auVar60._0_4_ = fVar133 * (float)local_6e0._0_4_;
            auVar60._8_4_ = fVar166 * fStack_6d8;
            auVar60._12_4_ = fVar167 * fStack_6d4;
            auVar60._16_4_ = fVar168 * fStack_6d0;
            auVar60._20_4_ = fVar169 * fStack_6cc;
            auVar60._24_4_ = fVar170 * fStack_6c8;
            auVar60._28_4_ = pfVar7[7];
            auVar13 = vfmadd231ps_fma(auVar189,auVar118,local_600);
            auVar14 = vfmadd231ps_fma(auVar211,auVar118,auVar159);
            auVar15 = vfmadd231ps_fma(auVar60,auVar118,local_780);
            auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar165,auVar219);
            auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar165,local_580);
            auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),local_6c0,auVar165);
            auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar120,auVar156);
            auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar120,local_560);
            auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar120,local_620);
            pfVar7 = (float *)(lVar24 + 0x222fee4 + lVar101 * 4);
            fVar133 = *pfVar7;
            fVar132 = pfVar7[1];
            fVar166 = pfVar7[2];
            fVar167 = pfVar7[3];
            fVar168 = pfVar7[4];
            fVar169 = pfVar7[5];
            fVar170 = pfVar7[6];
            auVar61._4_4_ = fVar197 * fVar132;
            auVar61._0_4_ = fVar191 * fVar133;
            auVar61._8_4_ = fVar198 * fVar166;
            auVar61._12_4_ = fVar199 * fVar167;
            auVar61._16_4_ = fVar200 * fVar168;
            auVar61._20_4_ = fVar201 * fVar169;
            auVar61._24_4_ = fVar202 * fVar170;
            auVar61._28_4_ = auVar23._28_4_;
            auVar62._4_4_ = fVar225 * fVar132;
            auVar62._0_4_ = fVar222 * fVar133;
            auVar62._8_4_ = fVar222 * fVar166;
            auVar62._12_4_ = fVar225 * fVar167;
            auVar62._16_4_ = fVar222 * fVar168;
            auVar62._20_4_ = fVar225 * fVar169;
            auVar62._24_4_ = fVar222 * fVar170;
            auVar62._28_4_ = auVar121._28_4_;
            auVar63._4_4_ = fVar132 * (float)local_6e0._4_4_;
            auVar63._0_4_ = fVar133 * (float)local_6e0._0_4_;
            auVar63._8_4_ = fVar166 * fStack_6d8;
            auVar63._12_4_ = fVar167 * fStack_6d4;
            auVar63._16_4_ = fVar168 * fStack_6d0;
            auVar63._20_4_ = fVar169 * fStack_6cc;
            auVar63._24_4_ = fVar170 * fStack_6c8;
            auVar63._28_4_ = pfVar7[7];
            auVar120 = *(undefined1 (*) [32])(lVar24 + 0x222fa60 + lVar101 * 4);
            auVar16 = vfmadd231ps_fma(auVar61,auVar120,local_600);
            auVar107 = vfmadd231ps_fma(auVar62,auVar120,auVar159);
            auVar173 = vfmadd231ps_fma(auVar63,auVar120,local_780);
            auVar120 = *(undefined1 (*) [32])(lVar24 + 0x222f5dc + lVar101 * 4);
            auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar120,auVar219);
            auVar107 = vfmadd231ps_fma(ZEXT1632(auVar107),auVar120,local_580);
            auVar173 = vfmadd231ps_fma(ZEXT1632(auVar173),auVar120,local_6c0);
            auVar120 = *(undefined1 (*) [32])(lVar24 + 0x222f158 + lVar101 * 4);
            auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar120,auVar156);
            auVar107 = vfmadd231ps_fma(ZEXT1632(auVar107),auVar120,local_560);
            auVar173 = vfmadd231ps_fma(ZEXT1632(auVar173),local_620,auVar120);
            auVar120 = vandps_avx(ZEXT1632(auVar13),local_2e0);
            auVar165 = vandps_avx(ZEXT1632(auVar14),local_2e0);
            auVar165 = vmaxps_avx(auVar120,auVar165);
            auVar120 = vandps_avx(ZEXT1632(auVar15),local_2e0);
            auVar120 = vmaxps_avx(auVar165,auVar120);
            auVar120 = vcmpps_avx(auVar120,_local_4c0,1);
            auVar118 = vblendvps_avx(ZEXT1632(auVar13),auVar23,auVar120);
            auVar128 = vblendvps_avx(ZEXT1632(auVar14),auVar121,auVar120);
            auVar120 = vandps_avx(ZEXT1632(auVar16),local_2e0);
            auVar165 = vandps_avx(ZEXT1632(auVar107),local_2e0);
            auVar165 = vmaxps_avx(auVar120,auVar165);
            auVar120 = vandps_avx(local_2e0,ZEXT1632(auVar173));
            auVar120 = vmaxps_avx(auVar165,auVar120);
            auVar165 = vcmpps_avx(auVar120,_local_4c0,1);
            auVar120 = vblendvps_avx(ZEXT1632(auVar16),auVar23,auVar165);
            auVar165 = vblendvps_avx(ZEXT1632(auVar107),auVar121,auVar165);
            auVar12 = vfmadd213ps_fma(auVar110,local_620,ZEXT1632(auVar12));
            auVar13 = vfmadd213ps_fma(auVar118,auVar118,ZEXT832(0) << 0x20);
            auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar128,auVar128);
            auVar110 = vrsqrtps_avx(ZEXT1632(auVar13));
            fVar133 = auVar110._0_4_;
            fVar132 = auVar110._4_4_;
            fVar166 = auVar110._8_4_;
            fVar167 = auVar110._12_4_;
            fVar168 = auVar110._16_4_;
            fVar169 = auVar110._20_4_;
            fVar170 = auVar110._24_4_;
            auVar64._4_4_ = fVar132 * fVar132 * fVar132 * auVar13._4_4_ * -0.5;
            auVar64._0_4_ = fVar133 * fVar133 * fVar133 * auVar13._0_4_ * -0.5;
            auVar64._8_4_ = fVar166 * fVar166 * fVar166 * auVar13._8_4_ * -0.5;
            auVar64._12_4_ = fVar167 * fVar167 * fVar167 * auVar13._12_4_ * -0.5;
            auVar64._16_4_ = fVar168 * fVar168 * fVar168 * -0.0;
            auVar64._20_4_ = fVar169 * fVar169 * fVar169 * -0.0;
            auVar64._24_4_ = fVar170 * fVar170 * fVar170 * -0.0;
            auVar64._28_4_ = 0;
            auVar158._8_4_ = 0x3fc00000;
            auVar158._0_8_ = 0x3fc000003fc00000;
            auVar158._12_4_ = 0x3fc00000;
            auVar158._16_4_ = 0x3fc00000;
            auVar158._20_4_ = 0x3fc00000;
            auVar158._24_4_ = 0x3fc00000;
            auVar158._28_4_ = 0x3fc00000;
            auVar13 = vfmadd231ps_fma(auVar64,auVar158,auVar110);
            fVar133 = auVar13._0_4_;
            fVar132 = auVar13._4_4_;
            auVar65._4_4_ = auVar128._4_4_ * fVar132;
            auVar65._0_4_ = auVar128._0_4_ * fVar133;
            fVar166 = auVar13._8_4_;
            auVar65._8_4_ = auVar128._8_4_ * fVar166;
            fVar167 = auVar13._12_4_;
            auVar65._12_4_ = auVar128._12_4_ * fVar167;
            auVar65._16_4_ = auVar128._16_4_ * 0.0;
            auVar65._20_4_ = auVar128._20_4_ * 0.0;
            auVar65._24_4_ = auVar128._24_4_ * 0.0;
            auVar65._28_4_ = auVar128._28_4_;
            auVar66._4_4_ = fVar132 * -auVar118._4_4_;
            auVar66._0_4_ = fVar133 * -auVar118._0_4_;
            auVar66._8_4_ = fVar166 * -auVar118._8_4_;
            auVar66._12_4_ = fVar167 * -auVar118._12_4_;
            auVar66._16_4_ = -auVar118._16_4_ * 0.0;
            auVar66._20_4_ = -auVar118._20_4_ * 0.0;
            auVar66._24_4_ = -auVar118._24_4_ * 0.0;
            auVar66._28_4_ = auVar110._28_4_;
            auVar13 = vfmadd213ps_fma(auVar120,auVar120,ZEXT832(0) << 0x20);
            auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar165,auVar165);
            auVar110 = vrsqrtps_avx(ZEXT1632(auVar13));
            auVar67._28_4_ = local_560._28_4_;
            auVar67._0_28_ =
                 ZEXT1628(CONCAT412(fVar167 * 0.0,
                                    CONCAT48(fVar166 * 0.0,CONCAT44(fVar132 * 0.0,fVar133 * 0.0))));
            fVar133 = auVar110._0_4_;
            fVar132 = auVar110._4_4_;
            fVar166 = auVar110._8_4_;
            fVar167 = auVar110._12_4_;
            fVar168 = auVar110._16_4_;
            fVar169 = auVar110._20_4_;
            fVar170 = auVar110._24_4_;
            auVar68._4_4_ = fVar132 * fVar132 * fVar132 * auVar13._4_4_ * -0.5;
            auVar68._0_4_ = fVar133 * fVar133 * fVar133 * auVar13._0_4_ * -0.5;
            auVar68._8_4_ = fVar166 * fVar166 * fVar166 * auVar13._8_4_ * -0.5;
            auVar68._12_4_ = fVar167 * fVar167 * fVar167 * auVar13._12_4_ * -0.5;
            auVar68._16_4_ = fVar168 * fVar168 * fVar168 * -0.0;
            auVar68._20_4_ = fVar169 * fVar169 * fVar169 * -0.0;
            auVar68._24_4_ = fVar170 * fVar170 * fVar170 * -0.0;
            auVar68._28_4_ = 0;
            auVar13 = vfmadd231ps_fma(auVar68,auVar158,auVar110);
            fVar133 = auVar13._0_4_;
            fVar132 = auVar13._4_4_;
            auVar69._4_4_ = auVar165._4_4_ * fVar132;
            auVar69._0_4_ = auVar165._0_4_ * fVar133;
            fVar166 = auVar13._8_4_;
            auVar69._8_4_ = auVar165._8_4_ * fVar166;
            fVar167 = auVar13._12_4_;
            auVar69._12_4_ = auVar165._12_4_ * fVar167;
            auVar69._16_4_ = auVar165._16_4_ * 0.0;
            auVar69._20_4_ = auVar165._20_4_ * 0.0;
            auVar69._24_4_ = auVar165._24_4_ * 0.0;
            auVar69._28_4_ = 0;
            auVar70._4_4_ = fVar132 * -auVar120._4_4_;
            auVar70._0_4_ = fVar133 * -auVar120._0_4_;
            auVar70._8_4_ = fVar166 * -auVar120._8_4_;
            auVar70._12_4_ = fVar167 * -auVar120._12_4_;
            auVar70._16_4_ = -auVar120._16_4_ * 0.0;
            auVar70._20_4_ = -auVar120._20_4_ * 0.0;
            auVar70._24_4_ = -auVar120._24_4_ * 0.0;
            auVar70._28_4_ = 0;
            auVar71._28_4_ = 0xbf000000;
            auVar71._0_28_ =
                 ZEXT1628(CONCAT412(fVar167 * 0.0,
                                    CONCAT48(fVar166 * 0.0,CONCAT44(fVar132 * 0.0,fVar133 * 0.0))));
            auVar13 = vfmadd213ps_fma(auVar65,ZEXT1632(auVar153),auVar177);
            auVar110 = ZEXT1632(auVar153);
            auVar14 = vfmadd213ps_fma(auVar66,auVar110,auVar112);
            auVar15 = vfmadd213ps_fma(auVar67,auVar110,ZEXT1632(auVar12));
            auVar26 = vfnmadd213ps_fma(auVar65,auVar110,auVar177);
            auVar16 = vfmadd213ps_fma(auVar69,ZEXT1632(auVar150),auVar139);
            auVar149 = vfnmadd213ps_fma(auVar66,auVar110,auVar112);
            auVar110 = ZEXT1632(auVar150);
            auVar107 = vfmadd213ps_fma(auVar70,auVar110,auVar123);
            auVar177 = ZEXT1632(auVar153);
            auVar185 = vfnmadd231ps_fma(ZEXT1632(auVar12),auVar177,auVar67);
            auVar12 = vfmadd213ps_fma(auVar71,auVar110,ZEXT1632(auVar11));
            auVar174 = vfnmadd213ps_fma(auVar69,auVar110,auVar139);
            auVar175 = vfnmadd213ps_fma(auVar70,auVar110,auVar123);
            auVar186 = vfnmadd231ps_fma(ZEXT1632(auVar11),ZEXT1632(auVar150),auVar71);
            auVar110 = vsubps_avx(ZEXT1632(auVar107),ZEXT1632(auVar149));
            auVar120 = vsubps_avx(ZEXT1632(auVar12),ZEXT1632(auVar185));
            auVar182._0_4_ = auVar110._0_4_ * auVar185._0_4_;
            auVar182._4_4_ = auVar110._4_4_ * auVar185._4_4_;
            auVar182._8_4_ = auVar110._8_4_ * auVar185._8_4_;
            auVar182._12_4_ = auVar110._12_4_ * auVar185._12_4_;
            auVar182._16_4_ = auVar110._16_4_ * 0.0;
            auVar182._20_4_ = auVar110._20_4_ * 0.0;
            auVar182._24_4_ = auVar110._24_4_ * 0.0;
            auVar182._28_4_ = 0;
            auVar173 = vfmsub231ps_fma(auVar182,ZEXT1632(auVar149),auVar120);
            auVar72._4_4_ = auVar26._4_4_ * auVar120._4_4_;
            auVar72._0_4_ = auVar26._0_4_ * auVar120._0_4_;
            auVar72._8_4_ = auVar26._8_4_ * auVar120._8_4_;
            auVar72._12_4_ = auVar26._12_4_ * auVar120._12_4_;
            auVar72._16_4_ = auVar120._16_4_ * 0.0;
            auVar72._20_4_ = auVar120._20_4_ * 0.0;
            auVar72._24_4_ = auVar120._24_4_ * 0.0;
            auVar72._28_4_ = auVar120._28_4_;
            auVar161 = ZEXT1632(auVar26);
            auVar120 = vsubps_avx(ZEXT1632(auVar16),auVar161);
            auVar121 = ZEXT1632(auVar185);
            auVar11 = vfmsub231ps_fma(auVar72,auVar121,auVar120);
            auVar73._4_4_ = auVar149._4_4_ * auVar120._4_4_;
            auVar73._0_4_ = auVar149._0_4_ * auVar120._0_4_;
            auVar73._8_4_ = auVar149._8_4_ * auVar120._8_4_;
            auVar73._12_4_ = auVar149._12_4_ * auVar120._12_4_;
            auVar73._16_4_ = auVar120._16_4_ * 0.0;
            auVar73._20_4_ = auVar120._20_4_ * 0.0;
            auVar73._24_4_ = auVar120._24_4_ * 0.0;
            auVar73._28_4_ = auVar120._28_4_;
            auVar26 = vfmsub231ps_fma(auVar73,auVar161,auVar110);
            auVar11 = vfmadd231ps_fma(ZEXT1632(auVar26),ZEXT832(0) << 0x20,ZEXT1632(auVar11));
            auVar11 = vfmadd231ps_fma(ZEXT1632(auVar11),ZEXT832(0) << 0x20,ZEXT1632(auVar173));
            auVar21 = vcmpps_avx(ZEXT1632(auVar11),ZEXT832(0) << 0x20,2);
            auVar110 = vblendvps_avx(ZEXT1632(auVar174),ZEXT1632(auVar13),auVar21);
            auVar120 = vblendvps_avx(ZEXT1632(auVar175),ZEXT1632(auVar14),auVar21);
            auVar165 = vblendvps_avx(ZEXT1632(auVar186),ZEXT1632(auVar15),auVar21);
            auVar118 = vblendvps_avx(auVar161,ZEXT1632(auVar16),auVar21);
            auVar128 = vblendvps_avx(ZEXT1632(auVar149),ZEXT1632(auVar107),auVar21);
            auVar22 = vblendvps_avx(auVar121,ZEXT1632(auVar12),auVar21);
            auVar161 = vblendvps_avx(ZEXT1632(auVar16),auVar161,auVar21);
            auVar23 = vblendvps_avx(ZEXT1632(auVar107),ZEXT1632(auVar149),auVar21);
            auVar11 = vpackssdw_avx(local_520._0_16_,local_520._16_16_);
            auVar121 = vblendvps_avx(ZEXT1632(auVar12),auVar121,auVar21);
            auVar161 = vsubps_avx(auVar161,auVar110);
            auVar23 = vsubps_avx(auVar23,auVar120);
            auVar138 = vsubps_avx(auVar121,auVar165);
            auVar213 = ZEXT3264(auVar138);
            auVar112 = vsubps_avx(auVar110,auVar118);
            auVar123 = vsubps_avx(auVar120,auVar128);
            auVar139 = vsubps_avx(auVar165,auVar22);
            auVar162._0_4_ = auVar138._0_4_ * auVar110._0_4_;
            auVar162._4_4_ = auVar138._4_4_ * auVar110._4_4_;
            auVar162._8_4_ = auVar138._8_4_ * auVar110._8_4_;
            auVar162._12_4_ = auVar138._12_4_ * auVar110._12_4_;
            auVar162._16_4_ = auVar138._16_4_ * auVar110._16_4_;
            auVar162._20_4_ = auVar138._20_4_ * auVar110._20_4_;
            auVar162._24_4_ = auVar138._24_4_ * auVar110._24_4_;
            auVar162._28_4_ = 0;
            auVar12 = vfmsub231ps_fma(auVar162,auVar165,auVar161);
            auVar74._4_4_ = auVar161._4_4_ * auVar120._4_4_;
            auVar74._0_4_ = auVar161._0_4_ * auVar120._0_4_;
            auVar74._8_4_ = auVar161._8_4_ * auVar120._8_4_;
            auVar74._12_4_ = auVar161._12_4_ * auVar120._12_4_;
            auVar74._16_4_ = auVar161._16_4_ * auVar120._16_4_;
            auVar74._20_4_ = auVar161._20_4_ * auVar120._20_4_;
            auVar74._24_4_ = auVar161._24_4_ * auVar120._24_4_;
            auVar74._28_4_ = auVar121._28_4_;
            auVar13 = vfmsub231ps_fma(auVar74,auVar110,auVar23);
            auVar12 = vfmadd231ps_fma(ZEXT1632(auVar13),ZEXT1632(auVar12),_DAT_02020f00);
            auVar163._0_4_ = auVar23._0_4_ * auVar165._0_4_;
            auVar163._4_4_ = auVar23._4_4_ * auVar165._4_4_;
            auVar163._8_4_ = auVar23._8_4_ * auVar165._8_4_;
            auVar163._12_4_ = auVar23._12_4_ * auVar165._12_4_;
            auVar163._16_4_ = auVar23._16_4_ * auVar165._16_4_;
            auVar163._20_4_ = auVar23._20_4_ * auVar165._20_4_;
            auVar163._24_4_ = auVar23._24_4_ * auVar165._24_4_;
            auVar163._28_4_ = 0;
            auVar13 = vfmsub231ps_fma(auVar163,auVar120,auVar138);
            auVar13 = vfmadd231ps_fma(ZEXT1632(auVar12),ZEXT832(0) << 0x20,ZEXT1632(auVar13));
            auVar164._0_4_ = auVar139._0_4_ * auVar118._0_4_;
            auVar164._4_4_ = auVar139._4_4_ * auVar118._4_4_;
            auVar164._8_4_ = auVar139._8_4_ * auVar118._8_4_;
            auVar164._12_4_ = auVar139._12_4_ * auVar118._12_4_;
            auVar164._16_4_ = auVar139._16_4_ * auVar118._16_4_;
            auVar164._20_4_ = auVar139._20_4_ * auVar118._20_4_;
            auVar164._24_4_ = auVar139._24_4_ * auVar118._24_4_;
            auVar164._28_4_ = 0;
            auVar12 = vfmsub231ps_fma(auVar164,auVar112,auVar22);
            auVar75._4_4_ = auVar123._4_4_ * auVar22._4_4_;
            auVar75._0_4_ = auVar123._0_4_ * auVar22._0_4_;
            auVar75._8_4_ = auVar123._8_4_ * auVar22._8_4_;
            auVar75._12_4_ = auVar123._12_4_ * auVar22._12_4_;
            auVar75._16_4_ = auVar123._16_4_ * auVar22._16_4_;
            auVar75._20_4_ = auVar123._20_4_ * auVar22._20_4_;
            auVar75._24_4_ = auVar123._24_4_ * auVar22._24_4_;
            auVar75._28_4_ = auVar22._28_4_;
            auVar14 = vfmsub231ps_fma(auVar75,auVar128,auVar139);
            auVar76._4_4_ = auVar112._4_4_ * auVar128._4_4_;
            auVar76._0_4_ = auVar112._0_4_ * auVar128._0_4_;
            auVar76._8_4_ = auVar112._8_4_ * auVar128._8_4_;
            auVar76._12_4_ = auVar112._12_4_ * auVar128._12_4_;
            auVar76._16_4_ = auVar112._16_4_ * auVar128._16_4_;
            auVar76._20_4_ = auVar112._20_4_ * auVar128._20_4_;
            auVar76._24_4_ = auVar112._24_4_ * auVar128._24_4_;
            auVar76._28_4_ = auVar128._28_4_;
            auVar15 = vfmsub231ps_fma(auVar76,auVar123,auVar118);
            auVar12 = vfmadd231ps_fma(ZEXT1632(auVar15),ZEXT832(0) << 0x20,ZEXT1632(auVar12));
            auVar14 = vfmadd231ps_fma(ZEXT1632(auVar12),ZEXT832(0) << 0x20,ZEXT1632(auVar14));
            auVar118 = vmaxps_avx(ZEXT1632(auVar13),ZEXT1632(auVar14));
            auVar118 = vcmpps_avx(auVar118,ZEXT832(0) << 0x20,2);
            auVar12 = vpackssdw_avx(auVar118._0_16_,auVar118._16_16_);
            auVar12 = vpand_avx(auVar12,auVar11);
            auVar118 = vpmovsxwd_avx2(auVar12);
            if ((((((((auVar118 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar118 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar118 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar118 >> 0x7f,0) == '\0') &&
                  (auVar118 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar118 >> 0xbf,0) == '\0') &&
                (auVar118 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar118[0x1f]) {
LAB_018f94d4:
              auVar147._8_8_ = uStack_598;
              auVar147._0_8_ = local_5a0;
              auVar147._16_8_ = uStack_590;
              auVar147._24_8_ = uStack_588;
            }
            else {
              auVar77._4_4_ = auVar23._4_4_ * auVar139._4_4_;
              auVar77._0_4_ = auVar23._0_4_ * auVar139._0_4_;
              auVar77._8_4_ = auVar23._8_4_ * auVar139._8_4_;
              auVar77._12_4_ = auVar23._12_4_ * auVar139._12_4_;
              auVar77._16_4_ = auVar23._16_4_ * auVar139._16_4_;
              auVar77._20_4_ = auVar23._20_4_ * auVar139._20_4_;
              auVar77._24_4_ = auVar23._24_4_ * auVar139._24_4_;
              auVar77._28_4_ = auVar118._28_4_;
              auVar173 = vfmsub231ps_fma(auVar77,auVar123,auVar138);
              auVar183._0_4_ = auVar138._0_4_ * auVar112._0_4_;
              auVar183._4_4_ = auVar138._4_4_ * auVar112._4_4_;
              auVar183._8_4_ = auVar138._8_4_ * auVar112._8_4_;
              auVar183._12_4_ = auVar138._12_4_ * auVar112._12_4_;
              auVar183._16_4_ = auVar138._16_4_ * auVar112._16_4_;
              auVar183._20_4_ = auVar138._20_4_ * auVar112._20_4_;
              auVar183._24_4_ = auVar138._24_4_ * auVar112._24_4_;
              auVar183._28_4_ = 0;
              auVar107 = vfmsub231ps_fma(auVar183,auVar161,auVar139);
              auVar78._4_4_ = auVar161._4_4_ * auVar123._4_4_;
              auVar78._0_4_ = auVar161._0_4_ * auVar123._0_4_;
              auVar78._8_4_ = auVar161._8_4_ * auVar123._8_4_;
              auVar78._12_4_ = auVar161._12_4_ * auVar123._12_4_;
              auVar78._16_4_ = auVar161._16_4_ * auVar123._16_4_;
              auVar78._20_4_ = auVar161._20_4_ * auVar123._20_4_;
              auVar78._24_4_ = auVar161._24_4_ * auVar123._24_4_;
              auVar78._28_4_ = auVar123._28_4_;
              auVar26 = vfmsub231ps_fma(auVar78,auVar112,auVar23);
              auVar15 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar107),ZEXT1632(auVar26));
              auVar16 = vfmadd231ps_fma(ZEXT1632(auVar15),ZEXT1632(auVar173),ZEXT832(0) << 0x20);
              auVar118 = vrcpps_avx(ZEXT1632(auVar16));
              auVar212._8_4_ = 0x3f800000;
              auVar212._0_8_ = &DAT_3f8000003f800000;
              auVar212._12_4_ = 0x3f800000;
              auVar212._16_4_ = 0x3f800000;
              auVar212._20_4_ = 0x3f800000;
              auVar212._24_4_ = 0x3f800000;
              auVar212._28_4_ = 0x3f800000;
              auVar213 = ZEXT3264(auVar212);
              auVar15 = vfnmadd213ps_fma(auVar118,ZEXT1632(auVar16),auVar212);
              auVar15 = vfmadd132ps_fma(ZEXT1632(auVar15),auVar118,auVar118);
              auVar145._0_4_ = auVar26._0_4_ * auVar165._0_4_;
              auVar145._4_4_ = auVar26._4_4_ * auVar165._4_4_;
              auVar145._8_4_ = auVar26._8_4_ * auVar165._8_4_;
              auVar145._12_4_ = auVar26._12_4_ * auVar165._12_4_;
              auVar145._16_4_ = auVar165._16_4_ * 0.0;
              auVar145._20_4_ = auVar165._20_4_ * 0.0;
              auVar145._24_4_ = auVar165._24_4_ * 0.0;
              auVar145._28_4_ = 0;
              auVar107 = vfmadd231ps_fma(auVar145,ZEXT1632(auVar107),auVar120);
              auVar107 = vfmadd231ps_fma(ZEXT1632(auVar107),auVar110,ZEXT1632(auVar173));
              fVar133 = auVar15._0_4_;
              fVar132 = auVar15._4_4_;
              fVar166 = auVar15._8_4_;
              fVar167 = auVar15._12_4_;
              auVar165 = ZEXT1632(CONCAT412(fVar167 * auVar107._12_4_,
                                            CONCAT48(fVar166 * auVar107._8_4_,
                                                     CONCAT44(fVar132 * auVar107._4_4_,
                                                              fVar133 * auVar107._0_4_))));
              uVar105 = *(undefined4 *)(ray + k * 4 + 0x100);
              auVar146._4_4_ = uVar105;
              auVar146._0_4_ = uVar105;
              auVar146._8_4_ = uVar105;
              auVar146._12_4_ = uVar105;
              auVar146._16_4_ = uVar105;
              auVar146._20_4_ = uVar105;
              auVar146._24_4_ = uVar105;
              auVar146._28_4_ = uVar105;
              auVar92._4_4_ = uStack_13c;
              auVar92._0_4_ = local_140;
              auVar92._8_4_ = uStack_138;
              auVar92._12_4_ = uStack_134;
              auVar92._16_4_ = uStack_130;
              auVar92._20_4_ = uStack_12c;
              auVar92._24_4_ = uStack_128;
              auVar92._28_4_ = uStack_124;
              auVar110 = vcmpps_avx(auVar92,auVar165,2);
              auVar120 = vcmpps_avx(auVar165,auVar146,2);
              auVar110 = vandps_avx(auVar120,auVar110);
              auVar15 = vpackssdw_avx(auVar110._0_16_,auVar110._16_16_);
              auVar12 = vpand_avx(auVar12,auVar15);
              auVar110 = vpmovsxwd_avx2(auVar12);
              if ((((((((auVar110 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (auVar110 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar110 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar110 >> 0x7f,0) == '\0') &&
                    (auVar110 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(auVar110 >> 0xbf,0) == '\0') &&
                  (auVar110 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar110[0x1f]) goto LAB_018f94d4;
              auVar110 = vcmpps_avx(ZEXT1632(auVar16),ZEXT832(0) << 0x20,4);
              auVar15 = vpackssdw_avx(auVar110._0_16_,auVar110._16_16_);
              auVar12 = vpand_avx(auVar12,auVar15);
              auVar110 = vpmovsxwd_avx2(auVar12);
              auVar147._8_8_ = uStack_598;
              auVar147._0_8_ = local_5a0;
              auVar147._16_8_ = uStack_590;
              auVar147._24_8_ = uStack_588;
              if ((((((((auVar110 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar110 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar110 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar110 >> 0x7f,0) != '\0') ||
                    (auVar110 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar110 >> 0xbf,0) != '\0') ||
                  (auVar110 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar110[0x1f] < '\0') {
                auVar118 = ZEXT1632(CONCAT412(fVar167 * auVar13._12_4_,
                                              CONCAT48(fVar166 * auVar13._8_4_,
                                                       CONCAT44(fVar132 * auVar13._4_4_,
                                                                fVar133 * auVar13._0_4_))));
                auVar79._28_4_ = SUB84(uStack_588,4);
                auVar79._0_28_ =
                     ZEXT1628(CONCAT412(fVar167 * auVar14._12_4_,
                                        CONCAT48(fVar166 * auVar14._8_4_,
                                                 CONCAT44(fVar132 * auVar14._4_4_,
                                                          fVar133 * auVar14._0_4_))));
                auVar190._8_4_ = 0x3f800000;
                auVar190._0_8_ = &DAT_3f8000003f800000;
                auVar190._12_4_ = 0x3f800000;
                auVar190._16_4_ = 0x3f800000;
                auVar190._20_4_ = 0x3f800000;
                auVar190._24_4_ = 0x3f800000;
                auVar190._28_4_ = 0x3f800000;
                auVar120 = vsubps_avx(auVar190,auVar118);
                _local_320 = vblendvps_avx(auVar120,auVar118,auVar21);
                auVar120 = vsubps_avx(auVar190,auVar79);
                local_500 = vblendvps_avx(auVar120,auVar79,auVar21);
                local_340 = auVar165;
                auVar147 = auVar110;
              }
            }
            auVar87._4_4_ = fStack_75c;
            auVar87._0_4_ = local_760;
            auVar87._8_4_ = fStack_758;
            auVar87._12_4_ = fStack_754;
            auVar87._16_4_ = fStack_750;
            auVar87._20_4_ = fStack_74c;
            auVar87._24_4_ = fStack_748;
            auVar87._28_4_ = fStack_744;
            auVar184 = ZEXT3264(auVar87);
            if ((((((((auVar147 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar147 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar147 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar147 >> 0x7f,0) != '\0') ||
                  (auVar147 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar147 >> 0xbf,0) != '\0') ||
                (auVar147 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar147[0x1f] < '\0') {
              auVar110 = vsubps_avx(ZEXT1632(auVar150),auVar177);
              auVar150 = vfmadd213ps_fma(auVar110,_local_320,auVar177);
              fVar133 = *(float *)((long)pre->ray_space + k * 4 + -0x20);
              auVar80._4_4_ = (auVar150._4_4_ + auVar150._4_4_) * fVar133;
              auVar80._0_4_ = (auVar150._0_4_ + auVar150._0_4_) * fVar133;
              auVar80._8_4_ = (auVar150._8_4_ + auVar150._8_4_) * fVar133;
              auVar80._12_4_ = (auVar150._12_4_ + auVar150._12_4_) * fVar133;
              auVar80._16_4_ = fVar133 * 0.0;
              auVar80._20_4_ = fVar133 * 0.0;
              auVar80._24_4_ = fVar133 * 0.0;
              auVar80._28_4_ = fVar133;
              auVar110 = vcmpps_avx(local_340,auVar80,6);
              auVar120 = auVar147 & auVar110;
              if ((((((((auVar120 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar120 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar120 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar120 >> 0x7f,0) != '\0') ||
                    (auVar120 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar120 >> 0xbf,0) != '\0') ||
                  (auVar120 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar120[0x1f] < '\0') {
                local_3c0 = vandps_avx(auVar110,auVar147);
                auVar130._8_4_ = 0xbf800000;
                auVar130._0_8_ = 0xbf800000bf800000;
                auVar130._12_4_ = 0xbf800000;
                auVar130._16_4_ = 0xbf800000;
                auVar130._20_4_ = 0xbf800000;
                auVar130._24_4_ = 0xbf800000;
                auVar130._28_4_ = 0xbf800000;
                auVar143._8_4_ = 0x40000000;
                auVar143._0_8_ = 0x4000000040000000;
                auVar143._12_4_ = 0x40000000;
                auVar143._16_4_ = 0x40000000;
                auVar143._20_4_ = 0x40000000;
                auVar143._24_4_ = 0x40000000;
                auVar143._28_4_ = 0x40000000;
                auVar150 = vfmadd213ps_fma(local_500,auVar143,auVar130);
                local_480 = _local_320;
                local_460 = ZEXT1632(auVar150);
                local_440 = local_340;
                local_400 = local_6f0;
                uStack_3f8 = uStack_6e8;
                local_3f0 = local_700;
                uStack_3e8 = uStack_6f8;
                local_3e0 = local_710;
                uStack_3d8 = uStack_708;
                pGVar18 = (context->scene->geometries).items[uVar95].ptr;
                auVar195 = ZEXT3264(auVar87);
                local_500 = local_460;
                if ((pGVar18->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
                  bVar104 = false;
                  auVar131 = ZEXT3264(CONCAT428(fVar225,CONCAT424(fVar222,CONCAT420(fVar225,
                                                  CONCAT416(fVar222,CONCAT412(fVar225,CONCAT48(
                                                  fVar222,uVar106)))))));
                }
                else {
                  auVar131 = ZEXT3264(CONCAT428(fVar225,CONCAT424(fVar222,CONCAT420(fVar225,
                                                  CONCAT416(fVar222,CONCAT412(fVar225,CONCAT48(
                                                  fVar222,uVar106)))))));
                  if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                     (bVar104 = true, pGVar18->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                    fVar133 = (float)local_420;
                    local_3a0[0] = (fVar133 + (float)local_320._0_4_ + 0.0) * local_180;
                    local_3a0[1] = (fVar133 + (float)local_320._4_4_ + 1.0) * fStack_17c;
                    local_3a0[2] = (fVar133 + fStack_318 + 2.0) * fStack_178;
                    local_3a0[3] = (fVar133 + fStack_314 + 3.0) * fStack_174;
                    fStack_390 = (fVar133 + fStack_310 + 4.0) * fStack_170;
                    fStack_38c = (fVar133 + fStack_30c + 5.0) * fStack_16c;
                    fStack_388 = (fVar133 + fStack_308 + 6.0) * fStack_168;
                    fStack_384 = fVar133 + fStack_304 + 7.0;
                    local_500._0_8_ = auVar150._0_8_;
                    local_500._8_8_ = auVar150._8_8_;
                    local_380 = local_500._0_8_;
                    uStack_378 = local_500._8_8_;
                    uStack_370 = 0;
                    uStack_368 = 0;
                    local_360 = local_340._0_8_;
                    uStack_358 = local_340._8_8_;
                    uStack_350 = local_340._16_8_;
                    uStack_348 = local_340._24_8_;
                    uVar97 = vmovmskps_avx(local_3c0);
                    bVar104 = uVar97 != 0;
                    if (bVar104) {
                      uVar98 = (ulong)(uVar97 & 0xff);
                      local_940 = ZEXT1632(CONCAT88(auVar11._8_8_,uVar98));
                      lVar25 = 0;
                      for (; (uVar98 & 1) == 0; uVar98 = uVar98 >> 1 | 0x8000000000000000) {
                        lVar25 = lVar25 + 1;
                      }
                      local_960 = ZEXT1632(CONCAT88(auVar153._8_8_,lVar25));
                      local_740._0_16_ = CONCAT88(uStack_6e8,local_6f0);
                      local_740 = ZEXT1632(local_740._0_16_);
                      local_640._0_16_ = CONCAT88(uStack_6f8,local_700);
                      local_640 = ZEXT1632(local_640._0_16_);
                      _local_660 = CONCAT88(uStack_708,local_710);
                      _local_660 = ZEXT1632(_local_660);
                      _local_680 = *pauVar6;
                      local_41c = iVar96;
                      local_410 = uVar172;
                      uStack_408 = uVar86;
                      do {
                        uVar105 = *(undefined4 *)(ray + k * 4 + 0x100);
                        fVar133 = local_3a0[local_960._0_8_];
                        auVar109._4_4_ = fVar133;
                        auVar109._0_4_ = fVar133;
                        auVar109._8_4_ = fVar133;
                        auVar109._12_4_ = fVar133;
                        local_240._16_4_ = fVar133;
                        local_240._0_16_ = auVar109;
                        local_240._20_4_ = fVar133;
                        local_240._24_4_ = fVar133;
                        local_240._28_4_ = fVar133;
                        local_220._4_4_ = *(undefined4 *)((long)&local_380 + local_960._0_8_ * 4);
                        *(undefined4 *)(ray + k * 4 + 0x100) =
                             *(undefined4 *)((long)&local_360 + local_960._0_8_ * 4);
                        fVar166 = 1.0 - fVar133;
                        auVar153 = ZEXT416((uint)(fVar133 * fVar166 * 4.0));
                        auVar150 = vfnmsub213ss_fma(auVar109,auVar109,auVar153);
                        auVar153 = vfmadd213ss_fma(ZEXT416((uint)fVar166),ZEXT416((uint)fVar166),
                                                   auVar153);
                        auVar184 = ZEXT464(0x3f000000);
                        fVar132 = auVar153._0_4_ * 0.5;
                        fVar133 = fVar133 * fVar133 * 0.5;
                        auVar154._0_4_ = fVar133 * (float)local_660._0_4_;
                        auVar154._4_4_ = fVar133 * (float)local_660._4_4_;
                        auVar154._8_4_ = fVar133 * (float)uStack_658;
                        auVar154._12_4_ = fVar133 * uStack_658._4_4_;
                        auVar136._4_4_ = fVar132;
                        auVar136._0_4_ = fVar132;
                        auVar136._8_4_ = fVar132;
                        auVar136._12_4_ = fVar132;
                        auVar153 = vfmadd132ps_fma(auVar136,auVar154,local_640._0_16_);
                        fVar133 = auVar150._0_4_ * 0.5;
                        auVar155._4_4_ = fVar133;
                        auVar155._0_4_ = fVar133;
                        auVar155._8_4_ = fVar133;
                        auVar155._12_4_ = fVar133;
                        auVar153 = vfmadd132ps_fma(auVar155,auVar153,local_740._0_16_);
                        local_7b0.context = context->user;
                        fVar133 = fVar166 * -fVar166 * 0.5;
                        auVar137._4_4_ = fVar133;
                        auVar137._0_4_ = fVar133;
                        auVar137._8_4_ = fVar133;
                        auVar137._12_4_ = fVar133;
                        auVar150 = vfmadd132ps_fma(auVar137,auVar153,auVar20);
                        local_2a0 = auVar150._0_4_;
                        uStack_29c = local_2a0;
                        uStack_298 = local_2a0;
                        uStack_294 = local_2a0;
                        uStack_290 = local_2a0;
                        uStack_28c = local_2a0;
                        uStack_288 = local_2a0;
                        uStack_284 = local_2a0;
                        auVar153 = vmovshdup_avx(auVar150);
                        local_280 = auVar153._0_8_;
                        uStack_278 = local_280;
                        uStack_270 = local_280;
                        uStack_268 = local_280;
                        auVar153 = vshufps_avx(auVar150,auVar150,0xaa);
                        local_260 = auVar153._0_8_;
                        uStack_258 = local_260;
                        uStack_250 = local_260;
                        uStack_248 = local_260;
                        local_220._0_4_ = local_220._4_4_;
                        local_220._8_4_ = local_220._4_4_;
                        local_220._12_4_ = local_220._4_4_;
                        local_220._16_4_ = local_220._4_4_;
                        local_220._20_4_ = local_220._4_4_;
                        local_220._24_4_ = local_220._4_4_;
                        local_220._28_4_ = local_220._4_4_;
                        local_200 = local_540;
                        uStack_1f8 = CONCAT44(uStack_534,uStack_538);
                        uStack_1f0 = CONCAT44(uStack_52c,uStack_530);
                        uStack_1e8 = CONCAT44(uStack_524,uStack_528);
                        local_1e0._4_4_ = uStack_15c;
                        local_1e0._0_4_ = local_160;
                        local_1e0._8_4_ = uStack_158;
                        local_1e0._12_4_ = uStack_154;
                        local_1e0._16_4_ = uStack_150;
                        local_1e0._20_4_ = uStack_14c;
                        local_1e0._24_4_ = uStack_148;
                        local_1e0._28_4_ = uStack_144;
                        vpcmpeqd_avx2(local_1e0,local_1e0);
                        local_1c0 = (local_7b0.context)->instID[0];
                        uStack_1bc = local_1c0;
                        uStack_1b8 = local_1c0;
                        uStack_1b4 = local_1c0;
                        uStack_1b0 = local_1c0;
                        uStack_1ac = local_1c0;
                        uStack_1a8 = local_1c0;
                        uStack_1a4 = local_1c0;
                        local_1a0 = (local_7b0.context)->instPrimID[0];
                        uStack_19c = local_1a0;
                        uStack_198 = local_1a0;
                        uStack_194 = local_1a0;
                        uStack_190 = local_1a0;
                        uStack_18c = local_1a0;
                        uStack_188 = local_1a0;
                        uStack_184 = local_1a0;
                        local_5e0 = local_300._0_8_;
                        uStack_5d8 = local_300._8_8_;
                        uStack_5d0 = local_300._16_8_;
                        uStack_5c8 = local_300._24_8_;
                        local_7b0.valid = (int *)&local_5e0;
                        local_7b0.geometryUserPtr = pGVar18->userPtr;
                        local_7b0.hit = (RTCHitN *)&local_2a0;
                        local_7b0.N = 8;
                        local_7b0.ray = (RTCRayN *)ray;
                        if (pGVar18->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                          auVar184 = ZEXT1664(auVar184._0_16_);
                          auVar213 = ZEXT1664(auVar213._0_16_);
                          (*pGVar18->occlusionFilterN)(&local_7b0);
                        }
                        auVar90._8_8_ = uStack_5d8;
                        auVar90._0_8_ = local_5e0;
                        auVar90._16_8_ = uStack_5d0;
                        auVar90._24_8_ = uStack_5c8;
                        auVar120 = vpcmpeqd_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar90)
                        ;
                        auVar110 = _DAT_0205a980 & ~auVar120;
                        if ((((((((auVar110 >> 0x1f & (undefined1  [32])0x1) ==
                                  (undefined1  [32])0x0 &&
                                 (auVar110 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                                 ) && (auVar110 >> 0x5f & (undefined1  [32])0x1) ==
                                      (undefined1  [32])0x0) && SUB321(auVar110 >> 0x7f,0) == '\0')
                              && (auVar110 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0
                              ) && SUB321(auVar110 >> 0xbf,0) == '\0') &&
                            (auVar110 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                            -1 < auVar110[0x1f]) {
                          auVar120 = auVar120 ^ _DAT_0205a980;
                        }
                        else {
                          p_Var19 = context->args->filter;
                          if ((p_Var19 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar18->field_8).field_0x2 & 0x40) != 0)))) {
                            auVar184 = ZEXT1664(auVar184._0_16_);
                            auVar213 = ZEXT1664(auVar213._0_16_);
                            (*p_Var19)(&local_7b0);
                          }
                          auVar91._8_8_ = uStack_5d8;
                          auVar91._0_8_ = local_5e0;
                          auVar91._16_8_ = uStack_5d0;
                          auVar91._24_8_ = uStack_5c8;
                          auVar110 = vpcmpeqd_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),
                                                   auVar91);
                          auVar120 = auVar110 ^ _DAT_0205a980;
                          auVar144._8_4_ = 0xff800000;
                          auVar144._0_8_ = 0xff800000ff800000;
                          auVar144._12_4_ = 0xff800000;
                          auVar144._16_4_ = 0xff800000;
                          auVar144._20_4_ = 0xff800000;
                          auVar144._24_4_ = 0xff800000;
                          auVar144._28_4_ = 0xff800000;
                          auVar110 = vblendvps_avx(auVar144,*(undefined1 (*) [32])
                                                             (local_7b0.ray + 0x100),auVar110);
                          *(undefined1 (*) [32])(local_7b0.ray + 0x100) = auVar110;
                        }
                        if ((((((((auVar120 >> 0x1f & (undefined1  [32])0x1) !=
                                  (undefined1  [32])0x0 ||
                                 (auVar120 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                 ) || (auVar120 >> 0x5f & (undefined1  [32])0x1) !=
                                      (undefined1  [32])0x0) || SUB321(auVar120 >> 0x7f,0) != '\0')
                              || (auVar120 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0
                              ) || SUB321(auVar120 >> 0xbf,0) != '\0') ||
                            (auVar120 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                            auVar120[0x1f] < '\0') break;
                        *(undefined4 *)(ray + k * 4 + 0x100) = uVar105;
                        uVar100 = local_940._0_8_ ^ 1L << (local_960._0_8_ & 0x3f);
                        local_940._0_8_ = uVar100;
                        lVar25 = 0;
                        for (uVar98 = uVar100; (uVar98 & 1) == 0;
                            uVar98 = uVar98 >> 1 | 0x8000000000000000) {
                          lVar25 = lVar25 + 1;
                        }
                        bVar104 = uVar100 != 0;
                        local_960._0_8_ = lVar25;
                      } while (bVar104);
                    }
                    auVar195 = ZEXT3264(CONCAT428(fStack_744,
                                                  CONCAT424(fStack_748,
                                                            CONCAT420(fStack_74c,
                                                                      CONCAT416(fStack_750,
                                                                                CONCAT412(fStack_754
                                                                                          ,CONCAT48(
                                                  fStack_758,CONCAT44(fStack_75c,local_760))))))));
                    auVar131 = ZEXT3264(CONCAT428(fVar225,CONCAT424(fVar222,CONCAT420(fVar225,
                                                  CONCAT416(fVar222,CONCAT412(fVar225,CONCAT48(
                                                  fVar222,uVar106)))))));
                  }
                }
                bVar103 = (bool)(bVar103 | bVar104);
                auVar148 = ZEXT3264(local_600);
                goto LAB_018f8fa3;
              }
            }
            auVar148 = ZEXT3264(local_600);
            auVar131 = ZEXT3264(CONCAT428(fVar225,CONCAT424(fVar222,CONCAT420(fVar225,CONCAT416(
                                                  fVar222,CONCAT412(fVar225,CONCAT48(fVar222,uVar106
                                                                                    )))))));
            auVar195 = ZEXT3264(auVar87);
          }
LAB_018f8fa3:
          lVar101 = lVar101 + 8;
        } while ((int)lVar101 < iVar96);
      }
      if (bVar103) {
        return local_96d;
      }
      uVar105 = *(undefined4 *)(ray + k * 4 + 0x100);
      auVar119._4_4_ = uVar105;
      auVar119._0_4_ = uVar105;
      auVar119._8_4_ = uVar105;
      auVar119._12_4_ = uVar105;
      auVar119._16_4_ = uVar105;
      auVar119._20_4_ = uVar105;
      auVar119._24_4_ = uVar105;
      auVar119._28_4_ = uVar105;
      auVar110 = vcmpps_avx(local_80,auVar119,2);
      uVar95 = vmovmskps_avx(auVar110);
      uVar95 = (uint)uVar102 & uVar95;
      local_96d = uVar95 != 0;
    } while (local_96d);
  }
  return local_96d;
}

Assistant:

static __forceinline bool occluded_t(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }
          
          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }